

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  uint uVar51;
  ulong uVar52;
  long lVar53;
  byte bVar54;
  uint uVar55;
  uint uVar56;
  bool bVar57;
  ulong uVar58;
  ulong uVar59;
  float fVar60;
  undefined4 uVar61;
  float fVar62;
  float fVar91;
  float fVar93;
  vint4 bi_2;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar92;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined8 uVar94;
  vint4 bi_1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  vint4 ai_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  vint4 ai;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  float fVar144;
  float fVar145;
  float fVar162;
  float fVar163;
  vint4 bi;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar164;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  float fVar178;
  float fVar191;
  float fVar192;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar193;
  undefined1 auVar190 [32];
  vint4 ai_1;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar216;
  vfloat4 a0_3;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  vfloat4 a0_1;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  vfloat4 a0;
  undefined1 auVar238 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar245;
  float fVar253;
  float fVar254;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar255;
  undefined1 auVar252 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar269 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_50c;
  undefined1 local_508 [8];
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  ulong local_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [32];
  undefined1 local_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  ulong local_370;
  undefined1 local_368 [32];
  RTCFilterFunctionNArguments local_348;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 auStack_2e8 [16];
  uint auStack_2d8 [4];
  undefined8 local_2c8;
  undefined4 local_2c0;
  undefined8 local_2bc;
  undefined4 local_2b4;
  undefined4 local_2b0;
  uint local_2ac;
  uint local_2a8;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  uint uStack_178;
  float afStack_174 [7];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar268 [32];
  
  PVar4 = prim[1];
  uVar59 = (ulong)(byte)PVar4;
  fVar60 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar13 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  auVar63._0_4_ = fVar60 * auVar13._0_4_;
  auVar63._4_4_ = fVar60 * auVar13._4_4_;
  auVar63._8_4_ = fVar60 * auVar13._8_4_;
  auVar63._12_4_ = fVar60 * auVar13._12_4_;
  auVar146._0_4_ = fVar60 * (ray->dir).field_0.m128[0];
  auVar146._4_4_ = fVar60 * (ray->dir).field_0.m128[1];
  auVar146._8_4_ = fVar60 * (ray->dir).field_0.m128[2];
  auVar146._12_4_ = fVar60 * (ray->dir).field_0.m128[3];
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar265 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar265 = vcvtdq2ps_avx(auVar265);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar59 + 6)));
  auVar238 = vcvtdq2ps_avx(auVar238);
  uVar52 = (ulong)(uint)((int)(uVar59 * 9) * 2);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + uVar59 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  uVar52 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 + 6)));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar256._4_4_ = auVar146._0_4_;
  auVar256._0_4_ = auVar146._0_4_;
  auVar256._8_4_ = auVar146._0_4_;
  auVar256._12_4_ = auVar146._0_4_;
  auVar232 = vshufps_avx(auVar146,auVar146,0x55);
  auVar64 = vshufps_avx(auVar146,auVar146,0xaa);
  fVar60 = auVar64._0_4_;
  auVar229._0_4_ = fVar60 * auVar265._0_4_;
  fVar91 = auVar64._4_4_;
  auVar229._4_4_ = fVar91 * auVar265._4_4_;
  fVar122 = auVar64._8_4_;
  auVar229._8_4_ = fVar122 * auVar265._8_4_;
  fVar92 = auVar64._12_4_;
  auVar229._12_4_ = fVar92 * auVar265._12_4_;
  auVar217._0_4_ = auVar238._0_4_ * fVar60;
  auVar217._4_4_ = auVar238._4_4_ * fVar91;
  auVar217._8_4_ = auVar238._8_4_ * fVar122;
  auVar217._12_4_ = auVar238._12_4_ * fVar92;
  auVar194._0_4_ = auVar110._0_4_ * fVar60;
  auVar194._4_4_ = auVar110._4_4_ * fVar91;
  auVar194._8_4_ = auVar110._8_4_ * fVar122;
  auVar194._12_4_ = auVar110._12_4_ * fVar92;
  auVar64 = vfmadd231ps_fma(auVar229,auVar232,auVar10);
  auVar96 = vfmadd231ps_fma(auVar217,auVar232,auVar12);
  auVar232 = vfmadd231ps_fma(auVar194,auVar65,auVar232);
  auVar125 = vfmadd231ps_fma(auVar64,auVar256,auVar13);
  auVar96 = vfmadd231ps_fma(auVar96,auVar256,auVar11);
  auVar134 = vfmadd231ps_fma(auVar232,auVar66,auVar256);
  auVar257._4_4_ = auVar63._0_4_;
  auVar257._0_4_ = auVar63._0_4_;
  auVar257._8_4_ = auVar63._0_4_;
  auVar257._12_4_ = auVar63._0_4_;
  auVar232 = vshufps_avx(auVar63,auVar63,0x55);
  auVar64 = vshufps_avx(auVar63,auVar63,0xaa);
  fVar60 = auVar64._0_4_;
  auVar147._0_4_ = fVar60 * auVar265._0_4_;
  fVar91 = auVar64._4_4_;
  auVar147._4_4_ = fVar91 * auVar265._4_4_;
  fVar122 = auVar64._8_4_;
  auVar147._8_4_ = fVar122 * auVar265._8_4_;
  fVar92 = auVar64._12_4_;
  auVar147._12_4_ = fVar92 * auVar265._12_4_;
  auVar95._0_4_ = auVar238._0_4_ * fVar60;
  auVar95._4_4_ = auVar238._4_4_ * fVar91;
  auVar95._8_4_ = auVar238._8_4_ * fVar122;
  auVar95._12_4_ = auVar238._12_4_ * fVar92;
  auVar64._0_4_ = auVar110._0_4_ * fVar60;
  auVar64._4_4_ = auVar110._4_4_ * fVar91;
  auVar64._8_4_ = auVar110._8_4_ * fVar122;
  auVar64._12_4_ = auVar110._12_4_ * fVar92;
  auVar10 = vfmadd231ps_fma(auVar147,auVar232,auVar10);
  auVar265 = vfmadd231ps_fma(auVar95,auVar232,auVar12);
  auVar12 = vfmadd231ps_fma(auVar64,auVar232,auVar65);
  auVar238 = vfmadd231ps_fma(auVar10,auVar257,auVar13);
  auVar65 = vfmadd231ps_fma(auVar265,auVar257,auVar11);
  auVar110 = vfmadd231ps_fma(auVar12,auVar257,auVar66);
  local_3f8._8_4_ = 0x7fffffff;
  local_3f8._0_8_ = 0x7fffffff7fffffff;
  local_3f8._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx(auVar125,local_3f8);
  auVar133._8_4_ = 0x219392ef;
  auVar133._0_8_ = 0x219392ef219392ef;
  auVar133._12_4_ = 0x219392ef;
  auVar13 = vcmpps_avx(auVar13,auVar133,1);
  auVar10 = vblendvps_avx(auVar125,auVar133,auVar13);
  auVar13 = vandps_avx(auVar96,local_3f8);
  auVar13 = vcmpps_avx(auVar13,auVar133,1);
  auVar265 = vblendvps_avx(auVar96,auVar133,auVar13);
  auVar13 = vandps_avx(auVar134,local_3f8);
  auVar13 = vcmpps_avx(auVar13,auVar133,1);
  auVar13 = vblendvps_avx(auVar134,auVar133,auVar13);
  auVar11 = vrcpps_avx(auVar10);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = 0x3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar11,auVar179);
  auVar11 = vfmadd132ps_fma(auVar10,auVar11,auVar11);
  auVar10 = vrcpps_avx(auVar265);
  auVar265 = vfnmadd213ps_fma(auVar265,auVar10,auVar179);
  auVar12 = vfmadd132ps_fma(auVar265,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar10,auVar179);
  auVar66 = vfmadd132ps_fma(auVar13,auVar10,auVar10);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar13 = vpmovsxwd_avx(auVar13);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar238);
  auVar134._0_4_ = auVar11._0_4_ * auVar13._0_4_;
  auVar134._4_4_ = auVar11._4_4_ * auVar13._4_4_;
  auVar134._8_4_ = auVar11._8_4_ * auVar13._8_4_;
  auVar134._12_4_ = auVar11._12_4_ * auVar13._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar13 = vpmovsxwd_avx(auVar10);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar238);
  auVar148._0_4_ = auVar11._0_4_ * auVar13._0_4_;
  auVar148._4_4_ = auVar11._4_4_ * auVar13._4_4_;
  auVar148._8_4_ = auVar11._8_4_ * auVar13._8_4_;
  auVar148._12_4_ = auVar11._12_4_ * auVar13._12_4_;
  auVar96._1_3_ = 0;
  auVar96[0] = PVar4;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar265);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar59 * -2 + 6);
  auVar13 = vpmovsxwd_avx(auVar11);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar65);
  auVar195._0_4_ = auVar13._0_4_ * auVar12._0_4_;
  auVar195._4_4_ = auVar13._4_4_ * auVar12._4_4_;
  auVar195._8_4_ = auVar13._8_4_ * auVar12._8_4_;
  auVar195._12_4_ = auVar13._12_4_ * auVar12._12_4_;
  auVar13 = vcvtdq2ps_avx(auVar10);
  auVar13 = vsubps_avx(auVar13,auVar65);
  auVar232._0_4_ = auVar12._0_4_ * auVar13._0_4_;
  auVar232._4_4_ = auVar12._4_4_ * auVar13._4_4_;
  auVar232._8_4_ = auVar12._8_4_ * auVar13._8_4_;
  auVar232._12_4_ = auVar12._12_4_ * auVar13._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar52 + uVar59 + 6);
  auVar13 = vpmovsxwd_avx(auVar12);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar110);
  auVar125._0_4_ = auVar66._0_4_ * auVar13._0_4_;
  auVar125._4_4_ = auVar66._4_4_ * auVar13._4_4_;
  auVar125._8_4_ = auVar66._8_4_ * auVar13._8_4_;
  auVar125._12_4_ = auVar66._12_4_ * auVar13._12_4_;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *(ulong *)(prim + uVar59 * 0x17 + 6);
  auVar13 = vpmovsxwd_avx(auVar238);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar110);
  auVar65._0_4_ = auVar66._0_4_ * auVar13._0_4_;
  auVar65._4_4_ = auVar66._4_4_ * auVar13._4_4_;
  auVar65._8_4_ = auVar66._8_4_ * auVar13._8_4_;
  auVar65._12_4_ = auVar66._12_4_ * auVar13._12_4_;
  auVar13 = vpminsd_avx(auVar134,auVar148);
  auVar10 = vpminsd_avx(auVar195,auVar232);
  auVar13 = vmaxps_avx(auVar13,auVar10);
  auVar10 = vpminsd_avx(auVar125,auVar65);
  uVar61 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar203._4_4_ = uVar61;
  auVar203._0_4_ = uVar61;
  auVar203._8_4_ = uVar61;
  auVar203._12_4_ = uVar61;
  auVar10 = vmaxps_avx(auVar10,auVar203);
  auVar13 = vmaxps_avx(auVar13,auVar10);
  local_258._0_4_ = auVar13._0_4_ * 0.99999964;
  local_258._4_4_ = auVar13._4_4_ * 0.99999964;
  local_258._8_4_ = auVar13._8_4_ * 0.99999964;
  local_258._12_4_ = auVar13._12_4_ * 0.99999964;
  auVar13 = vpmaxsd_avx(auVar134,auVar148);
  auVar10 = vpmaxsd_avx(auVar195,auVar232);
  auVar13 = vminps_avx(auVar13,auVar10);
  auVar10 = vpmaxsd_avx(auVar125,auVar65);
  fVar60 = ray->tfar;
  auVar110._4_4_ = fVar60;
  auVar110._0_4_ = fVar60;
  auVar110._8_4_ = fVar60;
  auVar110._12_4_ = fVar60;
  auVar10 = vminps_avx(auVar10,auVar110);
  auVar13 = vminps_avx(auVar13,auVar10);
  auVar66._0_4_ = auVar13._0_4_ * 1.0000004;
  auVar66._4_4_ = auVar13._4_4_ * 1.0000004;
  auVar66._8_4_ = auVar13._8_4_ * 1.0000004;
  auVar66._12_4_ = auVar13._12_4_ * 1.0000004;
  auVar96[4] = PVar4;
  auVar96._5_3_ = 0;
  auVar96[8] = PVar4;
  auVar96._9_3_ = 0;
  auVar96[0xc] = PVar4;
  auVar96._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar96,_DAT_01f7fcf0);
  auVar13 = vcmpps_avx(local_258,auVar66,2);
  auVar13 = vandps_avx(auVar13,auVar10);
  uVar51 = vmovmskps_avx(auVar13);
  if (uVar51 == 0) {
    return false;
  }
  uVar51 = uVar51 & 0xff;
  auVar88._16_16_ = mm_lookupmask_ps._240_16_;
  auVar88._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar88,ZEXT832(0) << 0x20,0x80);
LAB_016230e1:
  lVar53 = 0;
  uVar59 = (ulong)uVar51;
  for (uVar52 = uVar59; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
    lVar53 = lVar53 + 1;
  }
  local_4b0 = (ulong)*(uint *)(prim + 2);
  local_370 = (ulong)*(uint *)(prim + lVar53 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[local_4b0].ptr;
  uVar52 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_370);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar13 = *(undefined1 (*) [16])(_Var8 + uVar52 * (long)pvVar7);
  auVar10 = *(undefined1 (*) [16])(_Var8 + (uVar52 + 1) * (long)pvVar7);
  auVar265 = *(undefined1 (*) [16])(_Var8 + (uVar52 + 2) * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar52 + 3));
  fVar60 = *pfVar1;
  fVar91 = pfVar1[1];
  fVar122 = pfVar1[2];
  fVar92 = pfVar1[3];
  lVar53 = *(long *)&pGVar5[1].time_range.upper;
  auVar11 = *(undefined1 (*) [16])(lVar53 + (long)p_Var6 * uVar52);
  auVar12 = *(undefined1 (*) [16])(lVar53 + (long)p_Var6 * (uVar52 + 1));
  auVar238 = *(undefined1 (*) [16])(lVar53 + (long)p_Var6 * (uVar52 + 2));
  uVar59 = uVar59 - 1 & uVar59;
  pfVar1 = (float *)(lVar53 + (long)p_Var6 * (uVar52 + 3));
  fVar93 = *pfVar1;
  fVar62 = pfVar1[1];
  fVar145 = pfVar1[2];
  fVar216 = pfVar1[3];
  if (uVar59 != 0) {
    uVar58 = uVar59 - 1 & uVar59;
    for (uVar52 = uVar59; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
    }
    if (uVar58 != 0) {
      for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar97._8_4_ = 0x80000000;
  auVar97._0_8_ = 0x8000000080000000;
  auVar97._12_4_ = 0x80000000;
  auVar111._0_4_ = fVar93 * -0.0;
  auVar111._4_4_ = fVar62 * -0.0;
  auVar111._8_4_ = fVar145 * -0.0;
  auVar111._12_4_ = fVar216 * -0.0;
  auVar66 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar238,auVar111);
  auVar67._0_4_ = auVar12._0_4_ + auVar66._0_4_;
  auVar67._4_4_ = auVar12._4_4_ + auVar66._4_4_;
  auVar67._8_4_ = auVar12._8_4_ + auVar66._8_4_;
  auVar67._12_4_ = auVar12._12_4_ + auVar66._12_4_;
  auVar65 = vfmadd231ps_fma(auVar67,auVar11,auVar97);
  auVar125 = ZEXT816(0) << 0x40;
  auVar98._0_4_ = fVar93 * 0.0;
  auVar98._4_4_ = fVar62 * 0.0;
  auVar98._8_4_ = fVar145 * 0.0;
  auVar98._12_4_ = fVar216 * 0.0;
  auVar263._8_4_ = 0x3f000000;
  auVar263._0_8_ = 0x3f0000003f000000;
  auVar263._12_4_ = 0x3f000000;
  auVar66 = vfmadd231ps_fma(auVar98,auVar238,auVar263);
  auVar66 = vfmadd231ps_fma(auVar66,auVar12,auVar125);
  auVar64 = vfnmadd231ps_fma(auVar66,auVar11,auVar263);
  auVar246._0_4_ = fVar60 * -0.0;
  auVar246._4_4_ = fVar91 * -0.0;
  auVar246._8_4_ = fVar122 * -0.0;
  auVar246._12_4_ = fVar92 * -0.0;
  auVar66 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar265,auVar246);
  auVar237._0_4_ = auVar66._0_4_ + auVar10._0_4_;
  auVar237._4_4_ = auVar66._4_4_ + auVar10._4_4_;
  auVar237._8_4_ = auVar66._8_4_ + auVar10._8_4_;
  auVar237._12_4_ = auVar66._12_4_ + auVar10._12_4_;
  auVar66 = vfmadd231ps_fma(auVar237,auVar13,auVar97);
  auVar230._0_4_ = fVar60 * 0.0;
  auVar230._4_4_ = fVar91 * 0.0;
  auVar230._8_4_ = fVar122 * 0.0;
  auVar230._12_4_ = fVar92 * 0.0;
  auVar110 = vfmadd231ps_fma(auVar230,auVar265,auVar263);
  auVar110 = vfmadd231ps_fma(auVar110,auVar10,auVar125);
  auVar96 = vfnmadd231ps_fma(auVar110,auVar13,auVar263);
  auVar112._0_4_ = auVar238._0_4_ + auVar111._0_4_;
  auVar112._4_4_ = auVar238._4_4_ + auVar111._4_4_;
  auVar112._8_4_ = auVar238._8_4_ + auVar111._8_4_;
  auVar112._12_4_ = auVar238._12_4_ + auVar111._12_4_;
  auVar110 = vfmadd231ps_fma(auVar112,auVar12,auVar125);
  auVar110 = vfmadd231ps_fma(auVar110,auVar11,auVar97);
  auVar123._0_4_ = fVar93 * 0.5;
  auVar123._4_4_ = fVar62 * 0.5;
  auVar123._8_4_ = fVar145 * 0.5;
  auVar123._12_4_ = fVar216 * 0.5;
  auVar238 = vfmadd231ps_fma(auVar123,auVar125,auVar238);
  auVar12 = vfnmadd231ps_fma(auVar238,auVar263,auVar12);
  auVar232 = vfmadd231ps_fma(auVar12,auVar125,auVar11);
  auVar196._0_4_ = auVar246._0_4_ + auVar265._0_4_;
  auVar196._4_4_ = auVar246._4_4_ + auVar265._4_4_;
  auVar196._8_4_ = auVar246._8_4_ + auVar265._8_4_;
  auVar196._12_4_ = auVar246._12_4_ + auVar265._12_4_;
  auVar11 = vfmadd231ps_fma(auVar196,auVar10,auVar125);
  auVar12 = vfmadd231ps_fma(auVar11,auVar13,auVar97);
  auVar204._0_4_ = fVar60 * 0.5;
  auVar204._4_4_ = fVar91 * 0.5;
  auVar204._8_4_ = fVar122 * 0.5;
  auVar204._12_4_ = fVar92 * 0.5;
  auVar265 = vfmadd231ps_fma(auVar204,auVar125,auVar265);
  auVar10 = vfnmadd231ps_fma(auVar265,auVar263,auVar10);
  auVar238 = vfmadd231ps_fma(auVar10,auVar125,auVar13);
  auVar13 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar10 = vshufps_avx(auVar66,auVar66,0xc9);
  fVar93 = auVar64._0_4_;
  auVar149._0_4_ = fVar93 * auVar10._0_4_;
  fVar62 = auVar64._4_4_;
  auVar149._4_4_ = fVar62 * auVar10._4_4_;
  fVar145 = auVar64._8_4_;
  auVar149._8_4_ = fVar145 * auVar10._8_4_;
  fVar216 = auVar64._12_4_;
  auVar149._12_4_ = fVar216 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar149,auVar13,auVar66);
  auVar265 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar150._0_4_ = fVar93 * auVar10._0_4_;
  auVar150._4_4_ = fVar62 * auVar10._4_4_;
  auVar150._8_4_ = fVar145 * auVar10._8_4_;
  auVar150._12_4_ = fVar216 * auVar10._12_4_;
  auVar13 = vfmsub231ps_fma(auVar150,auVar13,auVar96);
  auVar11 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vshufps_avx(auVar232,auVar232,0xc9);
  auVar10 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar178 = auVar232._0_4_;
  auVar135._0_4_ = fVar178 * auVar10._0_4_;
  fVar191 = auVar232._4_4_;
  auVar135._4_4_ = fVar191 * auVar10._4_4_;
  fVar192 = auVar232._8_4_;
  auVar135._8_4_ = fVar192 * auVar10._8_4_;
  fVar193 = auVar232._12_4_;
  auVar135._12_4_ = fVar193 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar135,auVar13,auVar12);
  auVar12 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar238,auVar238,0xc9);
  auVar165._0_4_ = fVar178 * auVar10._0_4_;
  auVar165._4_4_ = fVar191 * auVar10._4_4_;
  auVar165._8_4_ = fVar192 * auVar10._8_4_;
  auVar165._12_4_ = fVar193 * auVar10._12_4_;
  auVar13 = vfmsub231ps_fma(auVar165,auVar13,auVar238);
  auVar238 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vdpps_avx(auVar265,auVar265,0x7f);
  fVar91 = auVar13._0_4_;
  auVar205._4_12_ = ZEXT812(0) << 0x20;
  auVar205._0_4_ = fVar91;
  auVar10 = vrsqrtss_avx(auVar205,auVar205);
  fVar60 = auVar10._0_4_;
  fVar60 = fVar60 * 1.5 + fVar91 * -0.5 * fVar60 * fVar60 * fVar60;
  auVar10 = vdpps_avx(auVar265,auVar11,0x7f);
  fVar144 = fVar60 * auVar265._0_4_;
  fVar162 = fVar60 * auVar265._4_4_;
  fVar163 = fVar60 * auVar265._8_4_;
  fVar164 = fVar60 * auVar265._12_4_;
  auVar218._0_4_ = auVar11._0_4_ * fVar91;
  auVar218._4_4_ = auVar11._4_4_ * fVar91;
  auVar218._8_4_ = auVar11._8_4_ * fVar91;
  auVar218._12_4_ = auVar11._12_4_ * fVar91;
  fVar91 = auVar10._0_4_;
  auVar180._0_4_ = fVar91 * auVar265._0_4_;
  auVar180._4_4_ = fVar91 * auVar265._4_4_;
  auVar180._8_4_ = fVar91 * auVar265._8_4_;
  auVar180._12_4_ = fVar91 * auVar265._12_4_;
  auVar265 = vsubps_avx(auVar218,auVar180);
  auVar10 = vrcpss_avx(auVar205,auVar205);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar10,SUB6416(ZEXT464(0x40000000),0));
  fVar122 = auVar10._0_4_ * auVar13._0_4_;
  auVar13 = vdpps_avx(auVar12,auVar12,0x7f);
  fVar92 = auVar13._0_4_;
  auVar206._4_12_ = ZEXT812(0) << 0x20;
  auVar206._0_4_ = fVar92;
  auVar10 = vrsqrtss_avx(auVar206,auVar206);
  fVar91 = auVar10._0_4_;
  auVar10 = vdpps_avx(auVar12,auVar238,0x7f);
  fVar91 = fVar91 * 1.5 + fVar92 * -0.5 * fVar91 * fVar91 * fVar91;
  fVar245 = fVar91 * auVar12._0_4_;
  fVar253 = fVar91 * auVar12._4_4_;
  fVar254 = fVar91 * auVar12._8_4_;
  fVar255 = fVar91 * auVar12._12_4_;
  auVar166._0_4_ = fVar92 * auVar238._0_4_;
  auVar166._4_4_ = fVar92 * auVar238._4_4_;
  auVar166._8_4_ = fVar92 * auVar238._8_4_;
  auVar166._12_4_ = fVar92 * auVar238._12_4_;
  fVar92 = auVar10._0_4_;
  auVar136._0_4_ = fVar92 * auVar12._0_4_;
  auVar136._4_4_ = fVar92 * auVar12._4_4_;
  auVar136._8_4_ = fVar92 * auVar12._8_4_;
  auVar136._12_4_ = fVar92 * auVar12._12_4_;
  auVar11 = vsubps_avx(auVar166,auVar136);
  auVar10 = vrcpss_avx(auVar206,auVar206);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar10,SUB6416(ZEXT464(0x40000000),0));
  fVar92 = auVar13._0_4_ * auVar10._0_4_;
  auVar13 = vshufps_avx(auVar65,auVar65,0xff);
  auVar197._0_4_ = auVar13._0_4_ * fVar144;
  auVar197._4_4_ = auVar13._4_4_ * fVar162;
  auVar197._8_4_ = auVar13._8_4_ * fVar163;
  auVar197._12_4_ = auVar13._12_4_ * fVar164;
  local_408 = vsubps_avx(auVar65,auVar197);
  auVar10 = vshufps_avx(auVar64,auVar64,0xff);
  auVar151._0_4_ = auVar10._0_4_ * fVar144 + auVar13._0_4_ * fVar60 * fVar122 * auVar265._0_4_;
  auVar151._4_4_ = auVar10._4_4_ * fVar162 + auVar13._4_4_ * fVar60 * fVar122 * auVar265._4_4_;
  auVar151._8_4_ = auVar10._8_4_ * fVar163 + auVar13._8_4_ * fVar60 * fVar122 * auVar265._8_4_;
  auVar151._12_4_ = auVar10._12_4_ * fVar164 + auVar13._12_4_ * fVar60 * fVar122 * auVar265._12_4_;
  auVar265 = vsubps_avx(auVar64,auVar151);
  local_418._0_4_ = auVar197._0_4_ + auVar65._0_4_;
  local_418._4_4_ = auVar197._4_4_ + auVar65._4_4_;
  fStack_410 = auVar197._8_4_ + auVar65._8_4_;
  fStack_40c = auVar197._12_4_ + auVar65._12_4_;
  auVar13 = vshufps_avx(auVar110,auVar110,0xff);
  auVar99._0_4_ = fVar245 * auVar13._0_4_;
  auVar99._4_4_ = fVar253 * auVar13._4_4_;
  auVar99._8_4_ = fVar254 * auVar13._8_4_;
  auVar99._12_4_ = fVar255 * auVar13._12_4_;
  local_428 = vsubps_avx(auVar110,auVar99);
  auVar10 = vshufps_avx(auVar232,auVar232,0xff);
  auVar68._0_4_ = fVar245 * auVar10._0_4_ + auVar13._0_4_ * fVar91 * auVar11._0_4_ * fVar92;
  auVar68._4_4_ = fVar253 * auVar10._4_4_ + auVar13._4_4_ * fVar91 * auVar11._4_4_ * fVar92;
  auVar68._8_4_ = fVar254 * auVar10._8_4_ + auVar13._8_4_ * fVar91 * auVar11._8_4_ * fVar92;
  auVar68._12_4_ = fVar255 * auVar10._12_4_ + auVar13._12_4_ * fVar91 * auVar11._12_4_ * fVar92;
  auVar13 = vsubps_avx(auVar232,auVar68);
  local_4a8 = auVar110._0_4_ + auVar99._0_4_;
  fStack_4a4 = auVar110._4_4_ + auVar99._4_4_;
  fStack_4a0 = auVar110._8_4_ + auVar99._8_4_;
  fStack_49c = auVar110._12_4_ + auVar99._12_4_;
  local_438._0_4_ = local_408._0_4_ + auVar265._0_4_ * 0.33333334;
  local_438._4_4_ = local_408._4_4_ + auVar265._4_4_ * 0.33333334;
  local_438._8_4_ = local_408._8_4_ + auVar265._8_4_ * 0.33333334;
  local_438._12_4_ = local_408._12_4_ + auVar265._12_4_ * 0.33333334;
  auVar69._0_4_ = auVar13._0_4_ * 0.33333334;
  auVar69._4_4_ = auVar13._4_4_ * 0.33333334;
  auVar69._8_4_ = auVar13._8_4_ * 0.33333334;
  auVar69._12_4_ = auVar13._12_4_ * 0.33333334;
  local_448 = vsubps_avx(local_428,auVar69);
  aVar2 = (ray->org).field_0;
  auVar265 = vsubps_avx(local_408,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar265,auVar265,0x55);
  auVar10 = vshufps_avx(auVar265,auVar265,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar60 = (pre->ray_space).vz.field_0.m128[0];
  fVar91 = (pre->ray_space).vz.field_0.m128[1];
  fVar122 = (pre->ray_space).vz.field_0.m128[2];
  fVar92 = (pre->ray_space).vz.field_0.m128[3];
  auVar70._0_4_ = fVar60 * auVar10._0_4_;
  auVar70._4_4_ = fVar91 * auVar10._4_4_;
  auVar70._8_4_ = fVar122 * auVar10._8_4_;
  auVar70._12_4_ = fVar92 * auVar10._12_4_;
  auVar232 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar3,auVar13);
  auVar11 = vsubps_avx(local_438,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar11,auVar11,0x55);
  auVar10 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar71._0_4_ = fVar60 * auVar10._0_4_;
  auVar71._4_4_ = fVar91 * auVar10._4_4_;
  auVar71._8_4_ = fVar122 * auVar10._8_4_;
  auVar71._12_4_ = fVar92 * auVar10._12_4_;
  auVar64 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar3,auVar13);
  auVar10 = vsubps_avx(local_448,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar72._0_4_ = fVar60 * auVar13._0_4_;
  auVar72._4_4_ = fVar91 * auVar13._4_4_;
  auVar72._8_4_ = fVar122 * auVar13._8_4_;
  auVar72._12_4_ = fVar92 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar10,auVar10,0x55);
  auVar96 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar3,auVar13);
  auVar12 = vsubps_avx(local_428,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar12,auVar12,0xaa);
  auVar73._0_4_ = fVar60 * auVar13._0_4_;
  auVar73._4_4_ = fVar91 * auVar13._4_4_;
  auVar73._8_4_ = fVar122 * auVar13._8_4_;
  auVar73._12_4_ = fVar92 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar12,auVar12,0x55);
  auVar125 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar3,auVar13);
  auVar238 = vsubps_avx(_local_418,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar238,auVar238,0xaa);
  auVar152._0_4_ = fVar60 * auVar13._0_4_;
  auVar152._4_4_ = fVar91 * auVar13._4_4_;
  auVar152._8_4_ = fVar122 * auVar13._8_4_;
  auVar152._12_4_ = fVar92 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar238,auVar238,0x55);
  auVar134 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar3,auVar13);
  local_458._0_4_ = (fVar93 + auVar151._0_4_) * 0.33333334 + (float)local_418._0_4_;
  local_458._4_4_ = (fVar62 + auVar151._4_4_) * 0.33333334 + (float)local_418._4_4_;
  fStack_450 = (fVar145 + auVar151._8_4_) * 0.33333334 + fStack_410;
  fStack_44c = (fVar216 + auVar151._12_4_) * 0.33333334 + fStack_40c;
  auVar66 = vsubps_avx(_local_458,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar66,auVar66,0xaa);
  auVar231._0_4_ = fVar60 * auVar13._0_4_;
  auVar231._4_4_ = fVar91 * auVar13._4_4_;
  auVar231._8_4_ = fVar122 * auVar13._8_4_;
  auVar231._12_4_ = fVar92 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar66,auVar66,0x55);
  auVar63 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar3,auVar13);
  auVar219._0_4_ = (fVar178 + auVar68._0_4_) * 0.33333334;
  auVar219._4_4_ = (fVar191 + auVar68._4_4_) * 0.33333334;
  auVar219._8_4_ = (fVar192 + auVar68._8_4_) * 0.33333334;
  auVar219._12_4_ = (fVar193 + auVar68._12_4_) * 0.33333334;
  auVar44._4_4_ = fStack_4a4;
  auVar44._0_4_ = local_4a8;
  auVar44._8_4_ = fStack_4a0;
  auVar44._12_4_ = fStack_49c;
  _local_468 = vsubps_avx(auVar44,auVar219);
  auVar65 = vsubps_avx(_local_468,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar65,auVar65,0xaa);
  auVar220._0_4_ = fVar60 * auVar13._0_4_;
  auVar220._4_4_ = fVar91 * auVar13._4_4_;
  auVar220._8_4_ = fVar122 * auVar13._8_4_;
  auVar220._12_4_ = fVar92 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar65,auVar65,0x55);
  auVar95 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar3,auVar13);
  auVar110 = vsubps_avx(auVar44,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar110,auVar110,0xaa);
  auVar181._0_4_ = fVar60 * auVar13._0_4_;
  auVar181._4_4_ = fVar91 * auVar13._4_4_;
  auVar181._8_4_ = fVar122 * auVar13._8_4_;
  auVar181._12_4_ = fVar92 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar110,auVar110,0x55);
  auVar13 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar3,auVar13);
  local_4c8._0_4_ = auVar265._0_4_;
  auVar167._4_4_ = local_4c8._0_4_;
  auVar167._0_4_ = local_4c8._0_4_;
  auVar167._8_4_ = local_4c8._0_4_;
  auVar167._12_4_ = local_4c8._0_4_;
  aVar3 = (pre->ray_space).vx.field_0;
  auVar232 = vfmadd231ps_fma(auVar232,(undefined1  [16])aVar3,auVar167);
  local_4d8._0_4_ = auVar11._0_4_;
  auVar168._4_4_ = local_4d8._0_4_;
  auVar168._0_4_ = local_4d8._0_4_;
  auVar168._8_4_ = local_4d8._0_4_;
  auVar168._12_4_ = local_4d8._0_4_;
  auVar11 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar3,auVar168);
  uVar61 = auVar10._0_4_;
  auVar169._4_4_ = uVar61;
  auVar169._0_4_ = uVar61;
  auVar169._8_4_ = uVar61;
  auVar169._12_4_ = uVar61;
  auVar64 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar3,auVar169);
  uVar61 = auVar12._0_4_;
  auVar170._4_4_ = uVar61;
  auVar170._0_4_ = uVar61;
  auVar170._8_4_ = uVar61;
  auVar170._12_4_ = uVar61;
  auVar12 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar3,auVar170);
  uVar61 = auVar238._0_4_;
  auVar171._4_4_ = uVar61;
  auVar171._0_4_ = uVar61;
  auVar171._8_4_ = uVar61;
  auVar171._12_4_ = uVar61;
  auVar238 = vfmadd231ps_fma(auVar134,(undefined1  [16])aVar3,auVar171);
  uVar61 = auVar66._0_4_;
  auVar172._4_4_ = uVar61;
  auVar172._0_4_ = uVar61;
  auVar172._8_4_ = uVar61;
  auVar172._12_4_ = uVar61;
  auVar66 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar3,auVar172);
  uVar61 = auVar65._0_4_;
  auVar74._4_4_ = uVar61;
  auVar74._0_4_ = uVar61;
  auVar74._8_4_ = uVar61;
  auVar74._12_4_ = uVar61;
  auVar65 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar3,auVar74);
  uVar61 = auVar110._0_4_;
  auVar75._4_4_ = uVar61;
  auVar75._0_4_ = uVar61;
  auVar75._8_4_ = uVar61;
  auVar75._12_4_ = uVar61;
  auVar110 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar75);
  local_478 = vmovlhps_avx(auVar232,auVar238);
  local_4d8 = vmovlhps_avx(auVar11,auVar66);
  local_4e8 = vmovlhps_avx(auVar64,auVar65);
  _local_238 = vmovlhps_avx(auVar12,auVar110);
  auVar13 = vminps_avx(local_478,local_4d8);
  auVar10 = vminps_avx(local_4e8,_local_238);
  auVar265 = vminps_avx(auVar13,auVar10);
  auVar13 = vmaxps_avx(local_478,local_4d8);
  auVar10 = vmaxps_avx(local_4e8,_local_238);
  auVar13 = vmaxps_avx(auVar13,auVar10);
  auVar10 = vshufpd_avx(auVar265,auVar265,3);
  auVar265 = vminps_avx(auVar265,auVar10);
  auVar10 = vshufpd_avx(auVar13,auVar13,3);
  auVar10 = vmaxps_avx(auVar13,auVar10);
  auVar13 = vandps_avx(local_3f8,auVar265);
  auVar10 = vandps_avx(local_3f8,auVar10);
  auVar13 = vmaxps_avx(auVar13,auVar10);
  auVar10 = vmovshdup_avx(auVar13);
  auVar13 = vmaxss_avx(auVar10,auVar13);
  local_198 = auVar13._0_4_ * 9.536743e-07;
  local_388._8_8_ = auVar232._0_8_;
  local_388._0_8_ = auVar232._0_8_;
  local_398._8_8_ = auVar11._0_8_;
  local_398._0_8_ = auVar11._0_8_;
  local_3a8._8_8_ = auVar64._0_8_;
  local_3a8._0_8_ = auVar64._0_8_;
  local_3b8._8_8_ = auVar12._0_8_;
  local_3b8._0_8_ = auVar12._0_8_;
  register0x000012c8 = auVar238._0_8_;
  local_3c8 = auVar238._0_8_;
  local_3d8 = auVar65._0_8_;
  register0x00001488 = local_3d8;
  register0x00001348 = auVar110._0_8_;
  local_3e8 = auVar110._0_8_;
  local_4c8 = ZEXT416((uint)local_198);
  fStack_1b0 = -local_198;
  local_1b8 = -local_198;
  fStack_1b4 = -local_198;
  fStack_1ac = fStack_1b0;
  fStack_1a8 = fStack_1b0;
  fStack_1a4 = fStack_1b0;
  fStack_1a0 = fStack_1b0;
  fStack_19c = fStack_1b0;
  bVar57 = false;
  uVar51 = 0;
  local_208 = vsubps_avx(local_4d8,local_478);
  local_218 = vsubps_avx(local_4e8,local_4d8);
  local_228 = vsubps_avx(_local_238,local_4e8);
  local_268 = vsubps_avx(_local_418,local_408);
  local_278 = vsubps_avx(_local_458,local_438);
  local_288 = vsubps_avx(_local_468,local_448);
  auVar45._4_4_ = fStack_4a4;
  auVar45._0_4_ = local_4a8;
  auVar45._8_4_ = fStack_4a0;
  auVar45._12_4_ = fStack_49c;
  _local_298 = vsubps_avx(auVar45,local_428);
  auVar76 = ZEXT816(0x3f80000000000000);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_248 = auVar76;
LAB_01623850:
  auVar13 = vshufps_avx(auVar76,auVar76,0x50);
  auVar264._8_4_ = 0x3f800000;
  auVar264._0_8_ = 0x3f8000003f800000;
  auVar264._12_4_ = 0x3f800000;
  auVar268._16_4_ = 0x3f800000;
  auVar268._0_16_ = auVar264;
  auVar268._20_4_ = 0x3f800000;
  auVar268._24_4_ = 0x3f800000;
  auVar268._28_4_ = 0x3f800000;
  auVar10 = vsubps_avx(auVar264,auVar13);
  fVar60 = auVar13._0_4_;
  auVar77._0_4_ = local_3c8._0_4_ * fVar60;
  fVar91 = auVar13._4_4_;
  auVar77._4_4_ = local_3c8._4_4_ * fVar91;
  fVar122 = auVar13._8_4_;
  auVar77._8_4_ = local_3c8._8_4_ * fVar122;
  fVar92 = auVar13._12_4_;
  auVar77._12_4_ = local_3c8._12_4_ * fVar92;
  fVar164 = auVar66._0_4_;
  auVar173._0_4_ = fVar164 * fVar60;
  fVar245 = auVar66._4_4_;
  auVar173._4_4_ = fVar245 * fVar91;
  auVar173._8_4_ = fVar164 * fVar122;
  auVar173._12_4_ = fVar245 * fVar92;
  auVar137._0_4_ = local_3d8._0_4_ * fVar60;
  auVar137._4_4_ = local_3d8._4_4_ * fVar91;
  auVar137._8_4_ = local_3d8._8_4_ * fVar122;
  auVar137._12_4_ = local_3d8._12_4_ * fVar92;
  auVar113._0_4_ = local_3e8._0_4_ * fVar60;
  auVar113._4_4_ = local_3e8._4_4_ * fVar91;
  auVar113._8_4_ = local_3e8._8_4_ * fVar122;
  auVar113._12_4_ = local_3e8._12_4_ * fVar92;
  auVar12 = vfmadd231ps_fma(auVar77,auVar10,local_388);
  auVar238 = vfmadd231ps_fma(auVar173,auVar10,local_398);
  auVar65 = vfmadd231ps_fma(auVar137,auVar10,local_3a8);
  auVar110 = vfmadd231ps_fma(auVar113,local_3b8,auVar10);
  auVar13 = vmovshdup_avx(local_248);
  fVar60 = local_248._0_4_;
  fStack_e0 = (auVar13._0_4_ - fVar60) * 0.04761905;
  auVar214._4_4_ = fVar60;
  auVar214._0_4_ = fVar60;
  auVar214._8_4_ = fVar60;
  auVar214._12_4_ = fVar60;
  auVar214._16_4_ = fVar60;
  auVar214._20_4_ = fVar60;
  auVar214._24_4_ = fVar60;
  auVar214._28_4_ = fVar60;
  auVar107._0_8_ = auVar13._0_8_;
  auVar107._8_8_ = auVar107._0_8_;
  auVar107._16_8_ = auVar107._0_8_;
  auVar107._24_8_ = auVar107._0_8_;
  auVar88 = vsubps_avx(auVar107,auVar214);
  uVar61 = auVar12._0_4_;
  auVar261._4_4_ = uVar61;
  auVar261._0_4_ = uVar61;
  auVar261._8_4_ = uVar61;
  auVar261._12_4_ = uVar61;
  auVar261._16_4_ = uVar61;
  auVar261._20_4_ = uVar61;
  auVar261._24_4_ = uVar61;
  auVar261._28_4_ = uVar61;
  auVar13 = vmovshdup_avx(auVar12);
  uVar94 = auVar13._0_8_;
  auVar252._8_8_ = uVar94;
  auVar252._0_8_ = uVar94;
  auVar252._16_8_ = uVar94;
  auVar252._24_8_ = uVar94;
  fVar178 = auVar238._0_4_;
  auVar242._4_4_ = fVar178;
  auVar242._0_4_ = fVar178;
  auVar242._8_4_ = fVar178;
  auVar242._12_4_ = fVar178;
  auVar242._16_4_ = fVar178;
  auVar242._20_4_ = fVar178;
  auVar242._24_4_ = fVar178;
  auVar242._28_4_ = fVar178;
  auVar10 = vmovshdup_avx(auVar238);
  auVar108._0_8_ = auVar10._0_8_;
  auVar108._8_8_ = auVar108._0_8_;
  auVar108._16_8_ = auVar108._0_8_;
  auVar108._24_8_ = auVar108._0_8_;
  fVar216 = auVar65._0_4_;
  auVar188._4_4_ = fVar216;
  auVar188._0_4_ = fVar216;
  auVar188._8_4_ = fVar216;
  auVar188._12_4_ = fVar216;
  auVar188._16_4_ = fVar216;
  auVar188._20_4_ = fVar216;
  auVar188._24_4_ = fVar216;
  auVar188._28_4_ = fVar216;
  auVar265 = vmovshdup_avx(auVar65);
  auVar201._0_8_ = auVar265._0_8_;
  auVar201._8_8_ = auVar201._0_8_;
  auVar201._16_8_ = auVar201._0_8_;
  auVar201._24_8_ = auVar201._0_8_;
  fVar145 = auVar110._0_4_;
  auVar11 = vmovshdup_avx(auVar110);
  auVar232 = vfmadd132ps_fma(auVar88,auVar214,_DAT_01faff20);
  auVar88 = vsubps_avx(auVar268,ZEXT1632(auVar232));
  fVar60 = auVar232._0_4_;
  fVar91 = auVar232._4_4_;
  auVar14._4_4_ = fVar178 * fVar91;
  auVar14._0_4_ = fVar178 * fVar60;
  fVar122 = auVar232._8_4_;
  auVar14._8_4_ = fVar178 * fVar122;
  fVar92 = auVar232._12_4_;
  auVar14._12_4_ = fVar178 * fVar92;
  auVar14._16_4_ = fVar178 * 0.0;
  auVar14._20_4_ = fVar178 * 0.0;
  auVar14._24_4_ = fVar178 * 0.0;
  auVar14._28_4_ = 0x3f800000;
  auVar232 = vfmadd231ps_fma(auVar14,auVar88,auVar261);
  fVar93 = auVar10._0_4_;
  fVar62 = auVar10._4_4_;
  auVar15._4_4_ = fVar62 * fVar91;
  auVar15._0_4_ = fVar93 * fVar60;
  auVar15._8_4_ = fVar93 * fVar122;
  auVar15._12_4_ = fVar62 * fVar92;
  auVar15._16_4_ = fVar93 * 0.0;
  auVar15._20_4_ = fVar62 * 0.0;
  auVar15._24_4_ = fVar93 * 0.0;
  auVar15._28_4_ = uVar61;
  auVar64 = vfmadd231ps_fma(auVar15,auVar88,auVar252);
  auVar16._4_4_ = fVar216 * fVar91;
  auVar16._0_4_ = fVar216 * fVar60;
  auVar16._8_4_ = fVar216 * fVar122;
  auVar16._12_4_ = fVar216 * fVar92;
  auVar16._16_4_ = fVar216 * 0.0;
  auVar16._20_4_ = fVar216 * 0.0;
  auVar16._24_4_ = fVar216 * 0.0;
  auVar16._28_4_ = auVar13._4_4_;
  auVar96 = vfmadd231ps_fma(auVar16,auVar88,auVar242);
  fVar93 = auVar265._0_4_;
  fVar62 = auVar265._4_4_;
  auVar9._4_4_ = fVar62 * fVar91;
  auVar9._0_4_ = fVar93 * fVar60;
  auVar9._8_4_ = fVar93 * fVar122;
  auVar9._12_4_ = fVar62 * fVar92;
  auVar9._16_4_ = fVar93 * 0.0;
  auVar9._20_4_ = fVar62 * 0.0;
  auVar9._24_4_ = fVar93 * 0.0;
  auVar9._28_4_ = fVar178;
  auVar125 = vfmadd231ps_fma(auVar9,auVar88,auVar108);
  auVar13 = vshufps_avx(auVar12,auVar12,0xaa);
  local_498._8_8_ = auVar13._0_8_;
  local_498._0_8_ = local_498._8_8_;
  local_498._16_8_ = local_498._8_8_;
  local_498._24_8_ = local_498._8_8_;
  auVar10 = vshufps_avx(auVar12,auVar12,0xff);
  uStack_500 = auVar10._0_8_;
  local_508 = (undefined1  [8])uStack_500;
  uStack_4f8 = uStack_500;
  uStack_4f0 = uStack_500;
  auVar17._4_4_ = fVar145 * fVar91;
  auVar17._0_4_ = fVar145 * fVar60;
  auVar17._8_4_ = fVar145 * fVar122;
  auVar17._12_4_ = fVar145 * fVar92;
  auVar17._16_4_ = fVar145 * 0.0;
  auVar17._20_4_ = fVar145 * 0.0;
  auVar17._24_4_ = fVar145 * 0.0;
  auVar17._28_4_ = fVar145;
  auVar12 = vfmadd231ps_fma(auVar17,auVar88,auVar188);
  auVar10 = vshufps_avx(auVar238,auVar238,0xaa);
  auVar189._0_8_ = auVar10._0_8_;
  auVar189._8_8_ = auVar189._0_8_;
  auVar189._16_8_ = auVar189._0_8_;
  auVar189._24_8_ = auVar189._0_8_;
  auVar265 = vshufps_avx(auVar238,auVar238,0xff);
  local_368._8_8_ = auVar265._0_8_;
  local_368._0_8_ = local_368._8_8_;
  local_368._16_8_ = local_368._8_8_;
  local_368._24_8_ = local_368._8_8_;
  fVar93 = auVar11._0_4_;
  fVar62 = auVar11._4_4_;
  auVar244._4_4_ = fVar62 * fVar91;
  auVar244._0_4_ = fVar93 * fVar60;
  auVar244._8_4_ = fVar93 * fVar122;
  auVar244._12_4_ = fVar62 * fVar92;
  auVar244._16_4_ = fVar93 * 0.0;
  auVar244._20_4_ = fVar62 * 0.0;
  auVar244._24_4_ = fVar93 * 0.0;
  auVar244._28_4_ = auVar13._4_4_;
  auVar134 = vfmadd231ps_fma(auVar244,auVar88,auVar201);
  auVar19._28_4_ = fVar62;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar96._12_4_ * fVar92,
                          CONCAT48(auVar96._8_4_ * fVar122,
                                   CONCAT44(auVar96._4_4_ * fVar91,auVar96._0_4_ * fVar60))));
  auVar232 = vfmadd231ps_fma(auVar19,auVar88,ZEXT1632(auVar232));
  fVar93 = auVar265._4_4_;
  auVar20._28_4_ = fVar93;
  auVar20._0_28_ =
       ZEXT1628(CONCAT412(auVar125._12_4_ * fVar92,
                          CONCAT48(auVar125._8_4_ * fVar122,
                                   CONCAT44(auVar125._4_4_ * fVar91,auVar125._0_4_ * fVar60))));
  auVar64 = vfmadd231ps_fma(auVar20,auVar88,ZEXT1632(auVar64));
  auVar13 = vshufps_avx(auVar65,auVar65,0xaa);
  uVar94 = auVar13._0_8_;
  auVar177._8_8_ = uVar94;
  auVar177._0_8_ = uVar94;
  auVar177._16_8_ = uVar94;
  auVar177._24_8_ = uVar94;
  auVar11 = vshufps_avx(auVar65,auVar65,0xff);
  uVar94 = auVar11._0_8_;
  auVar269._8_8_ = uVar94;
  auVar269._0_8_ = uVar94;
  auVar269._16_8_ = uVar94;
  auVar269._24_8_ = uVar94;
  auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar12._12_4_ * fVar92,
                                               CONCAT48(auVar12._8_4_ * fVar122,
                                                        CONCAT44(auVar12._4_4_ * fVar91,
                                                                 auVar12._0_4_ * fVar60)))),auVar88,
                            ZEXT1632(auVar96));
  auVar12 = vshufps_avx(auVar110,auVar110,0xaa);
  auVar238 = vshufps_avx(auVar110,auVar110,0xff);
  auVar110 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar134._12_4_,
                                                CONCAT48(fVar122 * auVar134._8_4_,
                                                         CONCAT44(fVar91 * auVar134._4_4_,
                                                                  fVar60 * auVar134._0_4_)))),
                             auVar88,ZEXT1632(auVar125));
  auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar65._12_4_,
                                               CONCAT48(fVar122 * auVar65._8_4_,
                                                        CONCAT44(fVar91 * auVar65._4_4_,
                                                                 fVar60 * auVar65._0_4_)))),auVar88,
                            ZEXT1632(auVar232));
  auVar14 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar232));
  auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar110._12_4_,
                                               CONCAT48(fVar122 * auVar110._8_4_,
                                                        CONCAT44(fVar91 * auVar110._4_4_,
                                                                 fVar60 * auVar110._0_4_)))),auVar88
                            ,ZEXT1632(auVar64));
  auVar15 = vsubps_avx(ZEXT1632(auVar110),ZEXT1632(auVar64));
  fStack_2fc = auVar15._28_4_;
  auVar243._0_4_ = fStack_e0 * auVar14._0_4_ * 3.0;
  auVar243._4_4_ = fStack_e0 * auVar14._4_4_ * 3.0;
  auVar243._8_4_ = fStack_e0 * auVar14._8_4_ * 3.0;
  auVar243._12_4_ = fStack_e0 * auVar14._12_4_ * 3.0;
  auVar243._16_4_ = fStack_e0 * auVar14._16_4_ * 3.0;
  auVar243._20_4_ = fStack_e0 * auVar14._20_4_ * 3.0;
  auVar243._24_4_ = fStack_e0 * auVar14._24_4_ * 3.0;
  auVar243._28_4_ = 0;
  local_318._0_4_ = fStack_e0 * auVar15._0_4_ * 3.0;
  local_318._4_4_ = fStack_e0 * auVar15._4_4_ * 3.0;
  fStack_310 = fStack_e0 * auVar15._8_4_ * 3.0;
  fStack_30c = fStack_e0 * auVar15._12_4_ * 3.0;
  fStack_308 = fStack_e0 * auVar15._16_4_ * 3.0;
  fStack_304 = fStack_e0 * auVar15._20_4_ * 3.0;
  fStack_300 = fStack_e0 * auVar15._24_4_ * 3.0;
  fVar62 = auVar10._0_4_;
  fVar145 = auVar10._4_4_;
  auVar21._4_4_ = fVar145 * fVar91;
  auVar21._0_4_ = fVar62 * fVar60;
  auVar21._8_4_ = fVar62 * fVar122;
  auVar21._12_4_ = fVar145 * fVar92;
  auVar21._16_4_ = fVar62 * 0.0;
  auVar21._20_4_ = fVar145 * 0.0;
  auVar21._24_4_ = fVar62 * 0.0;
  auVar21._28_4_ = fStack_2fc;
  auVar10 = vfmadd231ps_fma(auVar21,auVar88,local_498);
  fVar62 = auVar265._0_4_;
  auVar22._4_4_ = fVar93 * fVar91;
  auVar22._0_4_ = fVar62 * fVar60;
  auVar22._8_4_ = fVar62 * fVar122;
  auVar22._12_4_ = fVar93 * fVar92;
  auVar22._16_4_ = fVar62 * 0.0;
  auVar22._20_4_ = fVar93 * 0.0;
  auVar22._24_4_ = fVar62 * 0.0;
  auVar22._28_4_ = 0;
  auVar265 = vfmadd231ps_fma(auVar22,auVar88,_local_508);
  fVar93 = auVar13._0_4_;
  fVar62 = auVar13._4_4_;
  auVar23._4_4_ = fVar62 * fVar91;
  auVar23._0_4_ = fVar93 * fVar60;
  auVar23._8_4_ = fVar93 * fVar122;
  auVar23._12_4_ = fVar62 * fVar92;
  auVar23._16_4_ = fVar93 * 0.0;
  auVar23._20_4_ = fVar62 * 0.0;
  auVar23._24_4_ = fVar93 * 0.0;
  auVar23._28_4_ = auVar14._28_4_;
  auVar13 = vfmadd231ps_fma(auVar23,auVar88,auVar189);
  fVar93 = auVar11._0_4_;
  fVar216 = auVar11._4_4_;
  auVar24._4_4_ = fVar216 * fVar91;
  auVar24._0_4_ = fVar93 * fVar60;
  auVar24._8_4_ = fVar93 * fVar122;
  auVar24._12_4_ = fVar216 * fVar92;
  auVar24._16_4_ = fVar93 * 0.0;
  auVar24._20_4_ = fVar216 * 0.0;
  auVar24._24_4_ = fVar93 * 0.0;
  auVar24._28_4_ = fVar145;
  auVar11 = vfmadd231ps_fma(auVar24,auVar88,local_368);
  local_368 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar96));
  fVar93 = auVar12._0_4_;
  fVar62 = auVar12._4_4_;
  auVar25._4_4_ = fVar62 * fVar91;
  auVar25._0_4_ = fVar93 * fVar60;
  auVar25._8_4_ = fVar93 * fVar122;
  auVar25._12_4_ = fVar62 * fVar92;
  auVar25._16_4_ = fVar93 * 0.0;
  auVar25._20_4_ = fVar62 * 0.0;
  auVar25._24_4_ = fVar93 * 0.0;
  auVar25._28_4_ = fVar62;
  auVar12 = vfmadd231ps_fma(auVar25,auVar88,auVar177);
  _local_508 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar65));
  fVar93 = auVar238._0_4_;
  fVar62 = auVar238._4_4_;
  auVar26._4_4_ = fVar62 * fVar91;
  auVar26._0_4_ = fVar93 * fVar60;
  auVar26._8_4_ = fVar93 * fVar122;
  auVar26._12_4_ = fVar62 * fVar92;
  auVar26._16_4_ = fVar93 * 0.0;
  auVar26._20_4_ = fVar62 * 0.0;
  auVar26._24_4_ = fVar93 * 0.0;
  auVar26._28_4_ = fVar62;
  auVar238 = vfmadd231ps_fma(auVar26,auVar88,auVar269);
  auVar27._28_4_ = fVar216;
  auVar27._0_28_ =
       ZEXT1628(CONCAT412(auVar13._12_4_ * fVar92,
                          CONCAT48(auVar13._8_4_ * fVar122,
                                   CONCAT44(auVar13._4_4_ * fVar91,auVar13._0_4_ * fVar60))));
  auVar10 = vfmadd231ps_fma(auVar27,auVar88,ZEXT1632(auVar10));
  auVar265 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar11._12_4_,
                                                CONCAT48(fVar122 * auVar11._8_4_,
                                                         CONCAT44(fVar91 * auVar11._4_4_,
                                                                  fVar60 * auVar11._0_4_)))),auVar88
                             ,ZEXT1632(auVar265));
  local_498._0_4_ = auVar96._0_4_ + auVar243._0_4_;
  local_498._4_4_ = auVar96._4_4_ + auVar243._4_4_;
  local_498._8_4_ = auVar96._8_4_ + auVar243._8_4_;
  local_498._12_4_ = auVar96._12_4_ + auVar243._12_4_;
  local_498._16_4_ = auVar243._16_4_ + 0.0;
  local_498._20_4_ = auVar243._20_4_ + 0.0;
  local_498._24_4_ = auVar243._24_4_ + 0.0;
  local_498._28_4_ = 0;
  auVar13 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar12._12_4_ * fVar92,
                                               CONCAT48(auVar12._8_4_ * fVar122,
                                                        CONCAT44(auVar12._4_4_ * fVar91,
                                                                 auVar12._0_4_ * fVar60)))),auVar88,
                            ZEXT1632(auVar13));
  auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar238._12_4_ * fVar92,
                                               CONCAT48(auVar238._8_4_ * fVar122,
                                                        CONCAT44(auVar238._4_4_ * fVar91,
                                                                 auVar238._0_4_ * fVar60)))),auVar88
                            ,ZEXT1632(auVar11));
  auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar13._12_4_,
                                               CONCAT48(fVar122 * auVar13._8_4_,
                                                        CONCAT44(fVar91 * auVar13._4_4_,
                                                                 fVar60 * auVar13._0_4_)))),auVar88,
                            ZEXT1632(auVar10));
  auVar238 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar92,
                                                CONCAT48(auVar11._8_4_ * fVar122,
                                                         CONCAT44(auVar11._4_4_ * fVar91,
                                                                  auVar11._0_4_ * fVar60)))),
                             ZEXT1632(auVar265),auVar88);
  auVar88 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar10));
  auVar14 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar265));
  auVar262._0_4_ = fStack_e0 * auVar88._0_4_ * 3.0;
  auVar262._4_4_ = fStack_e0 * auVar88._4_4_ * 3.0;
  auVar262._8_4_ = fStack_e0 * auVar88._8_4_ * 3.0;
  auVar262._12_4_ = fStack_e0 * auVar88._12_4_ * 3.0;
  auVar262._16_4_ = fStack_e0 * auVar88._16_4_ * 3.0;
  auVar262._20_4_ = fStack_e0 * auVar88._20_4_ * 3.0;
  auVar262._24_4_ = fStack_e0 * auVar88._24_4_ * 3.0;
  auVar262._28_4_ = 0;
  local_f8 = fStack_e0 * auVar14._0_4_ * 3.0;
  fStack_f4 = fStack_e0 * auVar14._4_4_ * 3.0;
  auVar28._4_4_ = fStack_f4;
  auVar28._0_4_ = local_f8;
  fStack_f0 = fStack_e0 * auVar14._8_4_ * 3.0;
  auVar28._8_4_ = fStack_f0;
  fStack_ec = fStack_e0 * auVar14._12_4_ * 3.0;
  auVar28._12_4_ = fStack_ec;
  fStack_e8 = fStack_e0 * auVar14._16_4_ * 3.0;
  auVar28._16_4_ = fStack_e8;
  fStack_e4 = fStack_e0 * auVar14._20_4_ * 3.0;
  auVar28._20_4_ = fStack_e4;
  fStack_e0 = fStack_e0 * auVar14._24_4_ * 3.0;
  auVar28._24_4_ = fStack_e0;
  auVar28._28_4_ = 0x40400000;
  _local_2f8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar12));
  local_1d8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar238));
  auVar88 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar96));
  auVar14 = vsubps_avx(ZEXT1632(auVar238),ZEXT1632(auVar65));
  auVar15 = vsubps_avx(_local_2f8,local_368);
  fVar178 = auVar88._0_4_ + auVar15._0_4_;
  fVar191 = auVar88._4_4_ + auVar15._4_4_;
  fVar192 = auVar88._8_4_ + auVar15._8_4_;
  fVar193 = auVar88._12_4_ + auVar15._12_4_;
  fVar144 = auVar88._16_4_ + auVar15._16_4_;
  fVar162 = auVar88._20_4_ + auVar15._20_4_;
  fVar163 = auVar88._24_4_ + auVar15._24_4_;
  auVar16 = vsubps_avx(local_1d8,_local_508);
  auVar89._0_4_ = auVar14._0_4_ + auVar16._0_4_;
  auVar89._4_4_ = auVar14._4_4_ + auVar16._4_4_;
  auVar89._8_4_ = auVar14._8_4_ + auVar16._8_4_;
  auVar89._12_4_ = auVar14._12_4_ + auVar16._12_4_;
  auVar89._16_4_ = auVar14._16_4_ + auVar16._16_4_;
  auVar89._20_4_ = auVar14._20_4_ + auVar16._20_4_;
  auVar89._24_4_ = auVar14._24_4_ + auVar16._24_4_;
  auVar89._28_4_ = auVar14._28_4_ + auVar16._28_4_;
  local_98 = ZEXT1632(auVar65);
  fVar60 = auVar65._0_4_;
  local_118 = (float)local_318._0_4_ + fVar60;
  fVar91 = auVar65._4_4_;
  fStack_114 = (float)local_318._4_4_ + fVar91;
  fVar122 = auVar65._8_4_;
  fStack_110 = fStack_310 + fVar122;
  fVar92 = auVar65._12_4_;
  fStack_10c = fStack_30c + fVar92;
  fStack_108 = fStack_308 + 0.0;
  fStack_104 = fStack_304 + 0.0;
  fStack_100 = fStack_300 + 0.0;
  local_1f8 = ZEXT1632(auVar96);
  auVar14 = vsubps_avx(local_1f8,auVar243);
  local_78 = vpermps_avx2(_DAT_01fec480,auVar14);
  auVar14 = vsubps_avx(local_98,_local_318);
  local_138 = vpermps_avx2(_DAT_01fec480,auVar14);
  local_b8._0_4_ = auVar12._0_4_ + auVar262._0_4_;
  local_b8._4_4_ = auVar12._4_4_ + auVar262._4_4_;
  local_b8._8_4_ = auVar12._8_4_ + auVar262._8_4_;
  local_b8._12_4_ = auVar12._12_4_ + auVar262._12_4_;
  local_b8._16_4_ = auVar262._16_4_ + 0.0;
  local_b8._20_4_ = auVar262._20_4_ + 0.0;
  local_b8._24_4_ = auVar262._24_4_ + 0.0;
  local_b8._28_4_ = 0;
  auVar215 = ZEXT3264(local_b8);
  auVar244 = ZEXT1632(auVar12);
  auVar14 = vsubps_avx(auVar244,auVar262);
  auVar17 = vpermps_avx2(_DAT_01fec480,auVar14);
  fVar93 = auVar238._0_4_;
  local_f8 = fVar93 + local_f8;
  fVar62 = auVar238._4_4_;
  fStack_f4 = fVar62 + fStack_f4;
  fVar145 = auVar238._8_4_;
  fStack_f0 = fVar145 + fStack_f0;
  fVar216 = auVar238._12_4_;
  fStack_ec = fVar216 + fStack_ec;
  fStack_e8 = fStack_e8 + 0.0;
  fStack_e4 = fStack_e4 + 0.0;
  fStack_e0 = fStack_e0 + 0.0;
  auVar14 = vsubps_avx(ZEXT1632(auVar238),auVar28);
  local_d8 = vpermps_avx2(_DAT_01fec480,auVar14);
  auVar29._4_4_ = fVar91 * fVar191;
  auVar29._0_4_ = fVar60 * fVar178;
  auVar29._8_4_ = fVar122 * fVar192;
  auVar29._12_4_ = fVar92 * fVar193;
  auVar29._16_4_ = fVar144 * 0.0;
  auVar29._20_4_ = fVar162 * 0.0;
  auVar29._24_4_ = fVar163 * 0.0;
  auVar29._28_4_ = auVar14._28_4_;
  auVar13 = vfnmadd231ps_fma(auVar29,local_1f8,auVar89);
  fStack_fc = fStack_2fc + 0.0;
  auVar30._4_4_ = fStack_114 * fVar191;
  auVar30._0_4_ = local_118 * fVar178;
  auVar30._8_4_ = fStack_110 * fVar192;
  auVar30._12_4_ = fStack_10c * fVar193;
  auVar30._16_4_ = fStack_108 * fVar144;
  auVar30._20_4_ = fStack_104 * fVar162;
  auVar30._24_4_ = fStack_100 * fVar163;
  auVar30._28_4_ = 0;
  auVar10 = vfnmadd231ps_fma(auVar30,auVar89,local_498);
  auVar31._4_4_ = local_138._4_4_ * fVar191;
  auVar31._0_4_ = local_138._0_4_ * fVar178;
  auVar31._8_4_ = local_138._8_4_ * fVar192;
  auVar31._12_4_ = local_138._12_4_ * fVar193;
  auVar31._16_4_ = local_138._16_4_ * fVar144;
  auVar31._20_4_ = local_138._20_4_ * fVar162;
  auVar31._24_4_ = local_138._24_4_ * fVar163;
  auVar31._28_4_ = fStack_2fc + 0.0;
  auVar265 = vfnmadd231ps_fma(auVar31,local_78,auVar89);
  auVar32._4_4_ = (float)local_508._4_4_ * fVar191;
  auVar32._0_4_ = (float)local_508._0_4_ * fVar178;
  auVar32._8_4_ = (float)uStack_500 * fVar192;
  auVar32._12_4_ = uStack_500._4_4_ * fVar193;
  auVar32._16_4_ = (float)uStack_4f8 * fVar144;
  auVar32._20_4_ = uStack_4f8._4_4_ * fVar162;
  auVar32._24_4_ = (float)uStack_4f0 * fVar163;
  auVar32._28_4_ = uStack_4f0._4_4_;
  auVar11 = vfnmadd231ps_fma(auVar32,local_368,auVar89);
  auVar202._0_4_ = fVar93 * fVar178;
  auVar202._4_4_ = fVar62 * fVar191;
  auVar202._8_4_ = fVar145 * fVar192;
  auVar202._12_4_ = fVar216 * fVar193;
  auVar202._16_4_ = fVar144 * 0.0;
  auVar202._20_4_ = fVar162 * 0.0;
  auVar202._24_4_ = fVar163 * 0.0;
  auVar202._28_4_ = 0;
  auVar12 = vfnmadd231ps_fma(auVar202,auVar244,auVar89);
  uStack_dc = 0x40400000;
  auVar33._4_4_ = fStack_f4 * fVar191;
  auVar33._0_4_ = local_f8 * fVar178;
  auVar33._8_4_ = fStack_f0 * fVar192;
  auVar33._12_4_ = fStack_ec * fVar193;
  auVar33._16_4_ = fStack_e8 * fVar144;
  auVar33._20_4_ = fStack_e4 * fVar162;
  auVar33._24_4_ = fStack_e0 * fVar163;
  auVar33._28_4_ = local_368._28_4_;
  auVar65 = vfnmadd231ps_fma(auVar33,local_b8,auVar89);
  auVar34._4_4_ = local_d8._4_4_ * fVar191;
  auVar34._0_4_ = local_d8._0_4_ * fVar178;
  auVar34._8_4_ = local_d8._8_4_ * fVar192;
  auVar34._12_4_ = local_d8._12_4_ * fVar193;
  auVar34._16_4_ = local_d8._16_4_ * fVar144;
  auVar34._20_4_ = local_d8._20_4_ * fVar162;
  auVar34._24_4_ = local_d8._24_4_ * fVar163;
  auVar34._28_4_ = local_d8._28_4_;
  auVar110 = vfnmadd231ps_fma(auVar34,auVar17,auVar89);
  auVar35._4_4_ = local_1d8._4_4_ * fVar191;
  auVar35._0_4_ = local_1d8._0_4_ * fVar178;
  auVar35._8_4_ = local_1d8._8_4_ * fVar192;
  auVar35._12_4_ = local_1d8._12_4_ * fVar193;
  auVar35._16_4_ = local_1d8._16_4_ * fVar144;
  auVar35._20_4_ = local_1d8._20_4_ * fVar162;
  auVar35._24_4_ = local_1d8._24_4_ * fVar163;
  auVar35._28_4_ = auVar88._28_4_ + auVar15._28_4_;
  auVar232 = vfnmadd231ps_fma(auVar35,_local_2f8,auVar89);
  auVar14 = vminps_avx(ZEXT1632(auVar13),ZEXT1632(auVar10));
  auVar88 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar10));
  auVar15 = vminps_avx(ZEXT1632(auVar265),ZEXT1632(auVar11));
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar265),ZEXT1632(auVar11));
  auVar88 = vmaxps_avx(auVar88,auVar14);
  auVar16 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar65));
  auVar14 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar65));
  auVar9 = vminps_avx(ZEXT1632(auVar110),ZEXT1632(auVar232));
  auVar16 = vminps_avx(auVar16,auVar9);
  auVar16 = vminps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(ZEXT1632(auVar110),ZEXT1632(auVar232));
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(auVar88,auVar14);
  auVar49._4_4_ = fStack_194;
  auVar49._0_4_ = local_198;
  auVar49._8_4_ = fStack_190;
  auVar49._12_4_ = fStack_18c;
  auVar49._16_4_ = fStack_188;
  auVar49._20_4_ = fStack_184;
  auVar49._24_4_ = fStack_180;
  auVar49._28_4_ = fStack_17c;
  auVar88 = vcmpps_avx(auVar16,auVar49,2);
  auVar47._4_4_ = fStack_1b4;
  auVar47._0_4_ = local_1b8;
  auVar47._8_4_ = fStack_1b0;
  auVar47._12_4_ = fStack_1ac;
  auVar47._16_4_ = fStack_1a8;
  auVar47._20_4_ = fStack_1a4;
  auVar47._24_4_ = fStack_1a0;
  auVar47._28_4_ = fStack_19c;
  auVar14 = vcmpps_avx(auVar14,auVar47,5);
  auVar88 = vandps_avx(auVar14,auVar88);
  auVar14 = local_158 & auVar88;
  _local_318 = auVar17;
  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0x7f,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar14 >> 0xbf,0) != '\0') ||
      (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0') {
    auVar14 = vsubps_avx(local_368,local_1f8);
    auVar15 = vsubps_avx(_local_2f8,auVar244);
    fVar191 = auVar14._0_4_ + auVar15._0_4_;
    fVar192 = auVar14._4_4_ + auVar15._4_4_;
    fVar193 = auVar14._8_4_ + auVar15._8_4_;
    fVar144 = auVar14._12_4_ + auVar15._12_4_;
    fVar162 = auVar14._16_4_ + auVar15._16_4_;
    fVar163 = auVar14._20_4_ + auVar15._20_4_;
    fVar253 = auVar14._24_4_ + auVar15._24_4_;
    auVar16 = vsubps_avx(_local_508,local_98);
    auVar9 = vsubps_avx(local_1d8,ZEXT1632(auVar238));
    auVar109._0_4_ = auVar16._0_4_ + auVar9._0_4_;
    auVar109._4_4_ = auVar16._4_4_ + auVar9._4_4_;
    auVar109._8_4_ = auVar16._8_4_ + auVar9._8_4_;
    auVar109._12_4_ = auVar16._12_4_ + auVar9._12_4_;
    auVar109._16_4_ = auVar16._16_4_ + auVar9._16_4_;
    auVar109._20_4_ = auVar16._20_4_ + auVar9._20_4_;
    auVar109._24_4_ = auVar16._24_4_ + auVar9._24_4_;
    fVar178 = auVar9._28_4_;
    auVar109._28_4_ = auVar16._28_4_ + fVar178;
    auVar36._4_4_ = fVar91 * fVar192;
    auVar36._0_4_ = fVar60 * fVar191;
    auVar36._8_4_ = fVar122 * fVar193;
    auVar36._12_4_ = fVar92 * fVar144;
    auVar36._16_4_ = fVar162 * 0.0;
    auVar36._20_4_ = fVar163 * 0.0;
    auVar36._24_4_ = fVar253 * 0.0;
    auVar36._28_4_ = local_2f8._28_4_;
    auVar12 = vfnmadd231ps_fma(auVar36,auVar109,local_1f8);
    auVar37._4_4_ = fVar192 * fStack_114;
    auVar37._0_4_ = fVar191 * local_118;
    auVar37._8_4_ = fVar193 * fStack_110;
    auVar37._12_4_ = fVar144 * fStack_10c;
    auVar37._16_4_ = fVar162 * fStack_108;
    auVar37._20_4_ = fVar163 * fStack_104;
    auVar37._24_4_ = fVar253 * fStack_100;
    auVar37._28_4_ = 0;
    auVar13 = vfnmadd213ps_fma(local_498,auVar109,auVar37);
    auVar38._4_4_ = fVar192 * local_138._4_4_;
    auVar38._0_4_ = fVar191 * local_138._0_4_;
    auVar38._8_4_ = fVar193 * local_138._8_4_;
    auVar38._12_4_ = fVar144 * local_138._12_4_;
    auVar38._16_4_ = fVar162 * local_138._16_4_;
    auVar38._20_4_ = fVar163 * local_138._20_4_;
    auVar38._24_4_ = fVar253 * local_138._24_4_;
    auVar38._28_4_ = 0;
    auVar10 = vfnmadd213ps_fma(local_78,auVar109,auVar38);
    auVar39._4_4_ = (float)local_508._4_4_ * fVar192;
    auVar39._0_4_ = (float)local_508._0_4_ * fVar191;
    auVar39._8_4_ = (float)uStack_500 * fVar193;
    auVar39._12_4_ = uStack_500._4_4_ * fVar144;
    auVar39._16_4_ = (float)uStack_4f8 * fVar162;
    auVar39._20_4_ = uStack_4f8._4_4_ * fVar163;
    auVar39._24_4_ = (float)uStack_4f0 * fVar253;
    auVar39._28_4_ = 0;
    auVar238 = vfnmadd231ps_fma(auVar39,auVar109,local_368);
    auVar131._0_4_ = fVar93 * fVar191;
    auVar131._4_4_ = fVar62 * fVar192;
    auVar131._8_4_ = fVar145 * fVar193;
    auVar131._12_4_ = fVar216 * fVar144;
    auVar131._16_4_ = fVar162 * 0.0;
    auVar131._20_4_ = fVar163 * 0.0;
    auVar131._24_4_ = fVar253 * 0.0;
    auVar131._28_4_ = 0;
    auVar65 = vfnmadd231ps_fma(auVar131,auVar109,auVar244);
    auVar40._4_4_ = fVar192 * fStack_f4;
    auVar40._0_4_ = fVar191 * local_f8;
    auVar40._8_4_ = fVar193 * fStack_f0;
    auVar40._12_4_ = fVar144 * fStack_ec;
    auVar40._16_4_ = fVar162 * fStack_e8;
    auVar40._20_4_ = fVar163 * fStack_e4;
    auVar40._24_4_ = fVar253 * fStack_e0;
    auVar40._28_4_ = fVar178;
    auVar265 = vfnmadd213ps_fma(local_b8,auVar109,auVar40);
    auVar41._4_4_ = fVar192 * local_d8._4_4_;
    auVar41._0_4_ = fVar191 * local_d8._0_4_;
    auVar41._8_4_ = fVar193 * local_d8._8_4_;
    auVar41._12_4_ = fVar144 * local_d8._12_4_;
    auVar41._16_4_ = fVar162 * local_d8._16_4_;
    auVar41._20_4_ = fVar163 * local_d8._20_4_;
    auVar41._24_4_ = fVar253 * local_d8._24_4_;
    auVar41._28_4_ = fVar178;
    auVar11 = vfnmadd213ps_fma(auVar17,auVar109,auVar41);
    auVar215 = ZEXT1664(auVar11);
    auVar42._4_4_ = local_1d8._4_4_ * fVar192;
    auVar42._0_4_ = local_1d8._0_4_ * fVar191;
    auVar42._8_4_ = local_1d8._8_4_ * fVar193;
    auVar42._12_4_ = local_1d8._12_4_ * fVar144;
    auVar42._16_4_ = local_1d8._16_4_ * fVar162;
    auVar42._20_4_ = local_1d8._20_4_ * fVar163;
    auVar42._24_4_ = local_1d8._24_4_ * fVar253;
    auVar42._28_4_ = auVar14._28_4_ + auVar15._28_4_;
    auVar110 = vfnmadd231ps_fma(auVar42,_local_2f8,auVar109);
    auVar15 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
    auVar14 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
    auVar16 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar238));
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar238));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar9 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar265));
    auVar15 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar265));
    auVar17 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar110));
    auVar9 = vminps_avx(auVar9,auVar17);
    auVar9 = vminps_avx(auVar16,auVar9);
    auVar16 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar110));
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar14,auVar15);
    auVar50._4_4_ = fStack_194;
    auVar50._0_4_ = local_198;
    auVar50._8_4_ = fStack_190;
    auVar50._12_4_ = fStack_18c;
    auVar50._16_4_ = fStack_188;
    auVar50._20_4_ = fStack_184;
    auVar50._24_4_ = fStack_180;
    auVar50._28_4_ = fStack_17c;
    auVar14 = vcmpps_avx(auVar9,auVar50,2);
    auVar48._4_4_ = fStack_1b4;
    auVar48._0_4_ = local_1b8;
    auVar48._8_4_ = fStack_1b0;
    auVar48._12_4_ = fStack_1ac;
    auVar48._16_4_ = fStack_1a8;
    auVar48._20_4_ = fStack_1a4;
    auVar48._24_4_ = fStack_1a0;
    auVar48._28_4_ = fStack_19c;
    auVar15 = vcmpps_avx(auVar15,auVar48,5);
    auVar14 = vandps_avx(auVar15,auVar14);
    auVar88 = vandps_avx(local_158,auVar88);
    auVar15 = auVar88 & auVar14;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar88 = vandps_avx(auVar14,auVar88);
      uVar56 = vmovmskps_avx(auVar88);
      if (uVar56 != 0) {
        uVar58 = (ulong)uVar51;
        auStack_2d8[uVar58] = uVar56 & 0xff;
        uVar94 = vmovlps_avx(local_248);
        *(undefined8 *)(&uStack_178 + uVar58 * 2) = uVar94;
        uVar52 = vmovlps_avx(auVar76);
        auStack_58[uVar58] = uVar52;
        uVar51 = uVar51 + 1;
      }
    }
  }
LAB_01623dca:
  if (uVar51 != 0) {
    uVar58 = (ulong)(uVar51 - 1);
    uVar55 = auStack_2d8[uVar58];
    uVar56 = (&uStack_178)[uVar58 * 2];
    fVar60 = afStack_174[uVar58 * 2];
    iVar18 = 0;
    for (uVar52 = (ulong)uVar55; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
      iVar18 = iVar18 + 1;
    }
    uVar55 = uVar55 - 1 & uVar55;
    if (uVar55 == 0) {
      uVar51 = uVar51 - 1;
    }
    auVar76._8_8_ = 0;
    auVar76._0_8_ = auStack_58[uVar58];
    auStack_2d8[uVar58] = uVar55;
    fVar91 = (float)(iVar18 + 1) * 0.14285715;
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * (float)iVar18 * 0.14285715)),ZEXT416(uVar56),
                              ZEXT416((uint)(1.0 - (float)iVar18 * 0.14285715)));
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar91)),ZEXT416(uVar56),
                              ZEXT416((uint)(1.0 - fVar91)));
    fVar91 = auVar10._0_4_;
    auVar190._0_4_ = auVar13._0_4_;
    fVar60 = fVar91 - auVar190._0_4_;
    if (fVar60 < 0.16666667) {
      auVar265 = vshufps_avx(auVar76,auVar76,0x50);
      auVar100._8_4_ = 0x3f800000;
      auVar100._0_8_ = 0x3f8000003f800000;
      auVar100._12_4_ = 0x3f800000;
      auVar11 = vsubps_avx(auVar100,auVar265);
      fVar122 = auVar265._0_4_;
      auVar138._0_4_ = fVar122 * (float)local_3c8._0_4_;
      fVar92 = auVar265._4_4_;
      auVar138._4_4_ = fVar92 * (float)local_3c8._4_4_;
      fVar93 = auVar265._8_4_;
      auVar138._8_4_ = fVar93 * fStack_3c0;
      fVar62 = auVar265._12_4_;
      auVar138._12_4_ = fVar62 * fStack_3bc;
      auVar153._0_4_ = fVar164 * fVar122;
      auVar153._4_4_ = fVar245 * fVar92;
      auVar153._8_4_ = fVar164 * fVar93;
      auVar153._12_4_ = fVar245 * fVar62;
      auVar174._0_4_ = fVar122 * (float)local_3d8._0_4_;
      auVar174._4_4_ = fVar92 * (float)local_3d8._4_4_;
      auVar174._8_4_ = fVar93 * fStack_3d0;
      auVar174._12_4_ = fVar62 * fStack_3cc;
      auVar78._0_4_ = fVar122 * (float)local_3e8._0_4_;
      auVar78._4_4_ = fVar92 * (float)local_3e8._4_4_;
      auVar78._8_4_ = fVar93 * fStack_3e0;
      auVar78._12_4_ = fVar62 * fStack_3dc;
      auVar265 = vfmadd231ps_fma(auVar138,auVar11,local_388);
      auVar12 = vfmadd231ps_fma(auVar153,auVar11,local_398);
      auVar238 = vfmadd231ps_fma(auVar174,auVar11,local_3a8);
      auVar11 = vfmadd231ps_fma(auVar78,auVar11,local_3b8);
      auVar132._16_16_ = auVar265;
      auVar132._0_16_ = auVar265;
      auVar143._16_16_ = auVar12;
      auVar143._0_16_ = auVar12;
      auVar161._16_16_ = auVar238;
      auVar161._0_16_ = auVar238;
      _local_508 = auVar13;
      auVar190._4_4_ = auVar190._0_4_;
      auVar190._8_4_ = auVar190._0_4_;
      auVar190._12_4_ = auVar190._0_4_;
      local_498._0_16_ = auVar10;
      auVar190._20_4_ = fVar91;
      auVar190._16_4_ = fVar91;
      auVar190._24_4_ = fVar91;
      auVar190._28_4_ = fVar91;
      auVar88 = vsubps_avx(auVar143,auVar132);
      auVar12 = vfmadd213ps_fma(auVar88,auVar190,auVar132);
      auVar88 = vsubps_avx(auVar161,auVar143);
      auVar65 = vfmadd213ps_fma(auVar88,auVar190,auVar143);
      auVar265 = vsubps_avx(auVar11,auVar238);
      auVar90._16_16_ = auVar265;
      auVar90._0_16_ = auVar265;
      auVar265 = vfmadd213ps_fma(auVar90,auVar190,auVar161);
      auVar88 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar12));
      auVar11 = vfmadd213ps_fma(auVar88,auVar190,ZEXT1632(auVar12));
      auVar88 = vsubps_avx(ZEXT1632(auVar265),ZEXT1632(auVar65));
      auVar265 = vfmadd213ps_fma(auVar88,auVar190,ZEXT1632(auVar65));
      auVar88 = vsubps_avx(ZEXT1632(auVar265),ZEXT1632(auVar11));
      auVar64 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar88,auVar190);
      fVar216 = auVar88._4_4_ * 3.0;
      local_368._0_4_ = fVar60;
      fVar122 = fVar60 * 0.33333334;
      local_1d8._0_8_ =
           CONCAT44(auVar64._4_4_ + fVar122 * fVar216,auVar64._0_4_ + fVar122 * auVar88._0_4_ * 3.0)
      ;
      local_1d8._8_4_ = auVar64._8_4_ + fVar122 * auVar88._8_4_ * 3.0;
      local_1d8._12_4_ = auVar64._12_4_ + fVar122 * auVar88._12_4_ * 3.0;
      auVar11 = vshufpd_avx(auVar64,auVar64,3);
      auVar12 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_318 = auVar11;
      auVar265 = vsubps_avx(auVar11,auVar64);
      _local_2f8 = auVar12;
      auVar238 = vsubps_avx(auVar12,(undefined1  [16])0x0);
      auVar79._0_4_ = auVar265._0_4_ + auVar238._0_4_;
      auVar79._4_4_ = auVar265._4_4_ + auVar238._4_4_;
      auVar79._8_4_ = auVar265._8_4_ + auVar238._8_4_;
      auVar79._12_4_ = auVar265._12_4_ + auVar238._12_4_;
      auVar265 = vshufps_avx(auVar64,auVar64,0xb1);
      auVar238 = vshufps_avx(local_1d8._0_16_,local_1d8._0_16_,0xb1);
      auVar258._4_4_ = auVar79._0_4_;
      auVar258._0_4_ = auVar79._0_4_;
      auVar258._8_4_ = auVar79._0_4_;
      auVar258._12_4_ = auVar79._0_4_;
      auVar65 = vshufps_avx(auVar79,auVar79,0x55);
      fVar92 = auVar65._0_4_;
      auVar80._0_4_ = fVar92 * auVar265._0_4_;
      fVar93 = auVar65._4_4_;
      auVar80._4_4_ = fVar93 * auVar265._4_4_;
      fVar62 = auVar65._8_4_;
      auVar80._8_4_ = fVar62 * auVar265._8_4_;
      fVar145 = auVar65._12_4_;
      auVar80._12_4_ = fVar145 * auVar265._12_4_;
      auVar154._0_4_ = fVar92 * auVar238._0_4_;
      auVar154._4_4_ = fVar93 * auVar238._4_4_;
      auVar154._8_4_ = fVar62 * auVar238._8_4_;
      auVar154._12_4_ = fVar145 * auVar238._12_4_;
      auVar110 = vfmadd231ps_fma(auVar80,auVar258,auVar64);
      auVar232 = vfmadd231ps_fma(auVar154,auVar258,local_1d8._0_16_);
      auVar238 = vshufps_avx(auVar110,auVar110,0xe8);
      auVar65 = vshufps_avx(auVar232,auVar232,0xe8);
      auVar265 = vcmpps_avx(auVar238,auVar65,1);
      uVar56 = vextractps_avx(auVar265,0);
      auVar96 = auVar232;
      if ((uVar56 & 1) == 0) {
        auVar96 = auVar110;
      }
      auVar124._0_4_ = fVar122 * auVar88._16_4_ * 3.0;
      auVar124._4_4_ = fVar122 * fVar216;
      auVar124._8_4_ = fVar122 * auVar88._24_4_ * 3.0;
      auVar124._12_4_ = fVar122 * auVar215._28_4_;
      local_1f8._0_16_ = vsubps_avx((undefined1  [16])0x0,auVar124);
      auVar125 = vshufps_avx(local_1f8._0_16_,local_1f8._0_16_,0xb1);
      auVar134 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar182._0_4_ = fVar92 * auVar125._0_4_;
      auVar182._4_4_ = fVar93 * auVar125._4_4_;
      auVar182._8_4_ = fVar62 * auVar125._8_4_;
      auVar182._12_4_ = fVar145 * auVar125._12_4_;
      auVar198._0_4_ = auVar134._0_4_ * fVar92;
      auVar198._4_4_ = auVar134._4_4_ * fVar93;
      auVar198._8_4_ = auVar134._8_4_ * fVar62;
      auVar198._12_4_ = auVar134._12_4_ * fVar145;
      auVar95 = vfmadd231ps_fma(auVar182,auVar258,local_1f8._0_16_);
      auVar133 = vfmadd231ps_fma(auVar198,(undefined1  [16])0x0,auVar258);
      auVar134 = vshufps_avx(auVar95,auVar95,0xe8);
      auVar63 = vshufps_avx(auVar133,auVar133,0xe8);
      auVar215 = ZEXT1664(auVar63);
      auVar125 = vcmpps_avx(auVar134,auVar63,1);
      uVar56 = vextractps_avx(auVar125,0);
      auVar146 = auVar133;
      if ((uVar56 & 1) == 0) {
        auVar146 = auVar95;
      }
      auVar96 = vmaxss_avx(auVar146,auVar96);
      auVar238 = vminps_avx(auVar238,auVar65);
      auVar65 = vminps_avx(auVar134,auVar63);
      auVar65 = vminps_avx(auVar238,auVar65);
      auVar265 = vshufps_avx(auVar265,auVar265,0x55);
      auVar265 = vblendps_avx(auVar265,auVar125,2);
      auVar125 = vpslld_avx(auVar265,0x1f);
      auVar265 = vshufpd_avx(auVar232,auVar232,1);
      auVar265 = vinsertps_avx(auVar265,auVar133,0x9c);
      auVar238 = vshufpd_avx(auVar110,auVar110,1);
      auVar238 = vinsertps_avx(auVar238,auVar95,0x9c);
      auVar265 = vblendvps_avx(auVar238,auVar265,auVar125);
      auVar238 = vmovshdup_avx(auVar265);
      auVar265 = vmaxss_avx(auVar238,auVar265);
      fVar62 = auVar65._0_4_;
      auVar238 = vmovshdup_avx(auVar65);
      fVar93 = auVar265._0_4_;
      fVar122 = auVar238._0_4_;
      fVar92 = auVar96._0_4_;
      if (((0.0001 <= fVar62) || (fVar93 <= -0.0001)) && (0.0001 <= fVar122 || fVar93 <= -0.0001))
      goto code_r0x016240de;
      goto LAB_01624104;
    }
    local_248 = vinsertps_avx(auVar13,auVar10,0x10);
    goto LAB_01623850;
  }
  if (bVar57) {
    return bVar57;
  }
  fVar60 = ray->tfar;
  auVar87._4_4_ = fVar60;
  auVar87._0_4_ = fVar60;
  auVar87._8_4_ = fVar60;
  auVar87._12_4_ = fVar60;
  auVar13 = vcmpps_avx(local_258,auVar87,2);
  uVar51 = vmovmskps_avx(auVar13);
  uVar51 = (uint)uVar59 & uVar51;
  if (uVar51 == 0) {
    return bVar57;
  }
  goto LAB_016230e1;
code_r0x016240de:
  auVar238 = vcmpps_avx(auVar238,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar110 = vcmpps_avx(auVar65,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar238 = vandps_avx(auVar110,auVar238);
  if (fVar92 <= -0.0001 || (auVar238 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01623dca;
LAB_01624104:
  auVar110 = vcmpps_avx(auVar65,_DAT_01f7aa10,1);
  auVar232 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar238 = vcmpss_avx(auVar96,ZEXT816(0) << 0x20,1);
  auVar114._8_4_ = 0xbf800000;
  auVar114._0_8_ = 0xbf800000bf800000;
  auVar114._12_4_ = 0xbf800000;
  auVar238 = vblendvps_avx(auVar100,auVar114,auVar238);
  auVar110 = vblendvps_avx(auVar100,auVar114,auVar110);
  fVar216 = auVar110._0_4_;
  fVar145 = auVar238._0_4_;
  auVar238 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar216 == fVar145) && (!NAN(fVar216) && !NAN(fVar145))) {
    auVar238 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar216 == fVar145) && (!NAN(fVar216) && !NAN(fVar145))) {
    auVar232 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar110 = vmovshdup_avx(auVar110);
  fVar178 = auVar110._0_4_;
  if ((fVar216 != fVar178) || (NAN(fVar216) || NAN(fVar178))) {
    auVar183._12_4_ = 0;
    auVar183._0_12_ = ZEXT812(0);
    auVar183 = auVar183 << 0x20;
    if ((fVar122 != fVar62) || (NAN(fVar122) || NAN(fVar62))) {
      auVar126._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
      auVar126._8_4_ = auVar65._8_4_ ^ 0x80000000;
      auVar126._12_4_ = auVar65._12_4_ ^ 0x80000000;
      auVar127._0_4_ = -fVar62 / (fVar122 - fVar62);
      auVar127._4_12_ = auVar126._4_12_;
      auVar65 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar127._0_4_)),auVar183,auVar127);
      auVar110 = auVar65;
    }
    else {
      auVar65 = ZEXT816(0) << 0x20;
      if ((fVar62 != 0.0) || (auVar110 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar62))) {
        auVar65 = SUB6416(ZEXT464(0x7f800000),0);
        auVar110 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar238 = vminss_avx(auVar238,auVar65);
    auVar232 = vmaxss_avx(auVar110,auVar232);
  }
  else {
    auVar43._12_4_ = 0;
    auVar43._0_12_ = ZEXT812(0);
    auVar183 = auVar43 << 0x20;
  }
  auVar265 = vcmpss_avx(auVar265,auVar183,1);
  auVar115._8_4_ = 0xbf800000;
  auVar115._0_8_ = 0xbf800000bf800000;
  auVar115._12_4_ = 0xbf800000;
  auVar265 = vblendvps_avx(auVar100,auVar115,auVar265);
  fVar122 = auVar265._0_4_;
  auVar265 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar145 != fVar122) || (NAN(fVar145) || NAN(fVar122))) {
    if ((fVar93 != fVar92) || (NAN(fVar93) || NAN(fVar92))) {
      auVar81._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
      auVar81._8_4_ = auVar96._8_4_ ^ 0x80000000;
      auVar81._12_4_ = auVar96._12_4_ ^ 0x80000000;
      auVar128._0_4_ = -fVar92 / (fVar93 - fVar92);
      auVar128._4_12_ = auVar81._4_12_;
      auVar65 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar128._0_4_)),auVar183,auVar128);
      auVar110 = auVar65;
    }
    else {
      auVar65 = ZEXT816(0) << 0x20;
      if ((fVar92 != 0.0) || (auVar110 = auVar265, NAN(fVar92))) {
        auVar65 = SUB6416(ZEXT464(0x7f800000),0);
        auVar110 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar238 = vminss_avx(auVar238,auVar65);
    auVar232 = vmaxss_avx(auVar110,auVar232);
  }
  if ((fVar178 != fVar122) || (NAN(fVar178) || NAN(fVar122))) {
    auVar238 = vminss_avx(auVar238,auVar265);
    auVar232 = vmaxss_avx(auVar265,auVar232);
  }
  auVar238 = vmaxss_avx(auVar183,auVar238);
  auVar65 = vminss_avx(auVar232,auVar265);
  if (auVar65._0_4_ < auVar238._0_4_) goto LAB_01623dca;
  auVar238 = vmaxss_avx(auVar183,ZEXT416((uint)(auVar238._0_4_ + -0.1)));
  auVar265 = vminss_avx(ZEXT416((uint)(auVar65._0_4_ + 0.1)),auVar265);
  auVar139._0_8_ = auVar64._0_8_;
  auVar139._8_8_ = auVar139._0_8_;
  auVar207._8_8_ = local_1d8._0_8_;
  auVar207._0_8_ = local_1d8._0_8_;
  auVar221._8_8_ = local_1f8._0_8_;
  auVar221._0_8_ = local_1f8._0_8_;
  auVar65 = vshufpd_avx(local_1d8._0_16_,local_1d8._0_16_,3);
  auVar110 = vshufpd_avx(local_1f8._0_16_,local_1f8._0_16_,3);
  auVar232 = vshufps_avx(auVar238,auVar265,0);
  auVar64 = vsubps_avx(auVar100,auVar232);
  local_318._0_4_ = auVar11._0_4_;
  local_318._4_4_ = auVar11._4_4_;
  fStack_310 = auVar11._8_4_;
  fStack_30c = auVar11._12_4_;
  fVar122 = auVar232._0_4_;
  auVar82._0_4_ = fVar122 * (float)local_318._0_4_;
  fVar92 = auVar232._4_4_;
  auVar82._4_4_ = fVar92 * (float)local_318._4_4_;
  fVar93 = auVar232._8_4_;
  auVar82._8_4_ = fVar93 * fStack_310;
  fVar62 = auVar232._12_4_;
  auVar82._12_4_ = fVar62 * fStack_30c;
  auVar175._0_4_ = fVar122 * auVar65._0_4_;
  auVar175._4_4_ = fVar92 * auVar65._4_4_;
  auVar175._8_4_ = fVar93 * auVar65._8_4_;
  auVar175._12_4_ = fVar62 * auVar65._12_4_;
  auVar184._0_4_ = fVar122 * auVar110._0_4_;
  auVar184._4_4_ = fVar92 * auVar110._4_4_;
  auVar184._8_4_ = fVar93 * auVar110._8_4_;
  auVar184._12_4_ = fVar62 * auVar110._12_4_;
  local_2f8._0_4_ = auVar12._0_4_;
  local_2f8._4_4_ = auVar12._4_4_;
  fStack_2f0 = auVar12._8_4_;
  fStack_2ec = auVar12._12_4_;
  auVar199._0_4_ = fVar122 * (float)local_2f8._0_4_;
  auVar199._4_4_ = fVar92 * (float)local_2f8._4_4_;
  auVar199._8_4_ = fVar93 * fStack_2f0;
  auVar199._12_4_ = fVar62 * fStack_2ec;
  auVar65 = vfmadd231ps_fma(auVar82,auVar64,auVar139);
  auVar110 = vfmadd231ps_fma(auVar175,auVar64,auVar207);
  auVar232 = vfmadd231ps_fma(auVar184,auVar64,auVar221);
  auVar64 = vfmadd231ps_fma(auVar199,auVar64,ZEXT816(0));
  auVar11 = vmovshdup_avx(auVar76);
  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar238._0_4_)),auVar76,
                            ZEXT416((uint)(1.0 - auVar238._0_4_)));
  auVar133 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar265._0_4_)),auVar76,
                             ZEXT416((uint)(1.0 - auVar265._0_4_)));
  fVar122 = 1.0 / fVar60;
  auVar265 = vsubps_avx(auVar110,auVar65);
  auVar208._0_4_ = auVar265._0_4_ * 3.0;
  auVar208._4_4_ = auVar265._4_4_ * 3.0;
  auVar208._8_4_ = auVar265._8_4_ * 3.0;
  auVar208._12_4_ = auVar265._12_4_ * 3.0;
  auVar265 = vsubps_avx(auVar232,auVar110);
  auVar222._0_4_ = auVar265._0_4_ * 3.0;
  auVar222._4_4_ = auVar265._4_4_ * 3.0;
  auVar222._8_4_ = auVar265._8_4_ * 3.0;
  auVar222._12_4_ = auVar265._12_4_ * 3.0;
  auVar265 = vsubps_avx(auVar64,auVar232);
  auVar233._0_4_ = auVar265._0_4_ * 3.0;
  auVar233._4_4_ = auVar265._4_4_ * 3.0;
  auVar233._8_4_ = auVar265._8_4_ * 3.0;
  auVar233._12_4_ = auVar265._12_4_ * 3.0;
  auVar11 = vminps_avx(auVar222,auVar233);
  auVar265 = vmaxps_avx(auVar222,auVar233);
  auVar11 = vminps_avx(auVar208,auVar11);
  auVar265 = vmaxps_avx(auVar208,auVar265);
  auVar12 = vshufpd_avx(auVar11,auVar11,3);
  auVar238 = vshufpd_avx(auVar265,auVar265,3);
  auVar11 = vminps_avx(auVar11,auVar12);
  auVar265 = vmaxps_avx(auVar265,auVar238);
  auVar223._0_4_ = auVar11._0_4_ * fVar122;
  auVar223._4_4_ = auVar11._4_4_ * fVar122;
  auVar223._8_4_ = auVar11._8_4_ * fVar122;
  auVar223._12_4_ = auVar11._12_4_ * fVar122;
  auVar209._0_4_ = auVar265._0_4_ * fVar122;
  auVar209._4_4_ = auVar265._4_4_ * fVar122;
  auVar209._8_4_ = auVar265._8_4_ * fVar122;
  auVar209._12_4_ = auVar265._12_4_ * fVar122;
  fVar122 = 1.0 / (auVar133._0_4_ - auVar95._0_4_);
  auVar265 = vshufpd_avx(auVar65,auVar65,3);
  auVar11 = vshufpd_avx(auVar110,auVar110,3);
  auVar12 = vshufpd_avx(auVar232,auVar232,3);
  auVar238 = vshufpd_avx(auVar64,auVar64,3);
  auVar265 = vsubps_avx(auVar265,auVar65);
  auVar65 = vsubps_avx(auVar11,auVar110);
  auVar110 = vsubps_avx(auVar12,auVar232);
  auVar238 = vsubps_avx(auVar238,auVar64);
  auVar11 = vminps_avx(auVar265,auVar65);
  auVar265 = vmaxps_avx(auVar265,auVar65);
  auVar12 = vminps_avx(auVar110,auVar238);
  auVar12 = vminps_avx(auVar11,auVar12);
  auVar11 = vmaxps_avx(auVar110,auVar238);
  auVar265 = vmaxps_avx(auVar265,auVar11);
  auVar247._0_4_ = fVar122 * auVar12._0_4_;
  auVar247._4_4_ = fVar122 * auVar12._4_4_;
  auVar247._8_4_ = fVar122 * auVar12._8_4_;
  auVar247._12_4_ = fVar122 * auVar12._12_4_;
  auVar239._0_4_ = fVar122 * auVar265._0_4_;
  auVar239._4_4_ = fVar122 * auVar265._4_4_;
  auVar239._8_4_ = fVar122 * auVar265._8_4_;
  auVar239._12_4_ = fVar122 * auVar265._12_4_;
  auVar238 = vinsertps_avx(auVar13,auVar95,0x10);
  auVar65 = vinsertps_avx(auVar10,auVar133,0x10);
  auVar234._0_4_ = (auVar238._0_4_ + auVar65._0_4_) * 0.5;
  auVar234._4_4_ = (auVar238._4_4_ + auVar65._4_4_) * 0.5;
  auVar234._8_4_ = (auVar238._8_4_ + auVar65._8_4_) * 0.5;
  auVar234._12_4_ = (auVar238._12_4_ + auVar65._12_4_) * 0.5;
  auVar83._4_4_ = auVar234._0_4_;
  auVar83._0_4_ = auVar234._0_4_;
  auVar83._8_4_ = auVar234._0_4_;
  auVar83._12_4_ = auVar234._0_4_;
  auVar265 = vfmadd213ps_fma(local_208,auVar83,local_478);
  auVar11 = vfmadd213ps_fma(local_218,auVar83,local_4d8);
  auVar12 = vfmadd213ps_fma(local_228,auVar83,local_4e8);
  auVar10 = vsubps_avx(auVar11,auVar265);
  auVar265 = vfmadd213ps_fma(auVar10,auVar83,auVar265);
  auVar10 = vsubps_avx(auVar12,auVar11);
  auVar10 = vfmadd213ps_fma(auVar10,auVar83,auVar11);
  auVar10 = vsubps_avx(auVar10,auVar265);
  auVar265 = vfmadd231ps_fma(auVar265,auVar10,auVar83);
  auVar84._0_8_ = CONCAT44(auVar10._4_4_ * 3.0,auVar10._0_4_ * 3.0);
  auVar84._8_4_ = auVar10._8_4_ * 3.0;
  auVar84._12_4_ = auVar10._12_4_ * 3.0;
  auVar259._8_8_ = auVar265._0_8_;
  auVar259._0_8_ = auVar265._0_8_;
  auVar10 = vshufpd_avx(auVar265,auVar265,3);
  auVar265 = vshufps_avx(auVar234,auVar234,0x55);
  auVar232 = vsubps_avx(auVar10,auVar259);
  auVar96 = vfmadd231ps_fma(auVar259,auVar265,auVar232);
  auVar266._8_8_ = auVar84._0_8_;
  auVar266._0_8_ = auVar84._0_8_;
  auVar10 = vshufpd_avx(auVar84,auVar84,3);
  auVar10 = vsubps_avx(auVar10,auVar266);
  auVar64 = vfmadd213ps_fma(auVar10,auVar265,auVar266);
  auVar265 = vmovshdup_avx(auVar64);
  auVar267._0_8_ = auVar265._0_8_ ^ 0x8000000080000000;
  auVar267._8_4_ = auVar265._8_4_ ^ 0x80000000;
  auVar267._12_4_ = auVar265._12_4_ ^ 0x80000000;
  auVar11 = vmovshdup_avx(auVar232);
  auVar10 = vunpcklps_avx(auVar11,auVar267);
  auVar12 = vshufps_avx(auVar10,auVar267,4);
  auVar110 = vshufps_avx(auVar234,auVar234,0x54);
  auVar129._0_8_ = auVar232._0_8_ ^ 0x8000000080000000;
  auVar129._8_4_ = auVar232._8_4_ ^ 0x80000000;
  auVar129._12_4_ = auVar232._12_4_ ^ 0x80000000;
  auVar10 = vmovlhps_avx(auVar129,auVar64);
  auVar10 = vshufps_avx(auVar10,auVar64,8);
  auVar265 = vfmsub231ss_fma(ZEXT416((uint)(auVar232._0_4_ * auVar265._0_4_)),auVar11,auVar64);
  uVar61 = auVar265._0_4_;
  auVar85._4_4_ = uVar61;
  auVar85._0_4_ = uVar61;
  auVar85._8_4_ = uVar61;
  auVar85._12_4_ = uVar61;
  auVar265 = vdivps_avx(auVar12,auVar85);
  auVar11 = vdivps_avx(auVar10,auVar85);
  fVar93 = auVar96._0_4_;
  fVar122 = auVar265._0_4_;
  auVar10 = vshufps_avx(auVar96,auVar96,0x55);
  fVar92 = auVar11._0_4_;
  auVar86._0_4_ = fVar93 * fVar122 + auVar10._0_4_ * fVar92;
  auVar86._4_4_ = fVar93 * auVar265._4_4_ + auVar10._4_4_ * auVar11._4_4_;
  auVar86._8_4_ = fVar93 * auVar265._8_4_ + auVar10._8_4_ * auVar11._8_4_;
  auVar86._12_4_ = fVar93 * auVar265._12_4_ + auVar10._12_4_ * auVar11._12_4_;
  auVar63 = vsubps_avx(auVar110,auVar86);
  auVar110 = vmovshdup_avx(auVar265);
  auVar10 = vinsertps_avx(auVar223,auVar247,0x1c);
  auVar155._0_4_ = auVar110._0_4_ * auVar10._0_4_;
  auVar155._4_4_ = auVar110._4_4_ * auVar10._4_4_;
  auVar155._8_4_ = auVar110._8_4_ * auVar10._8_4_;
  auVar155._12_4_ = auVar110._12_4_ * auVar10._12_4_;
  auVar12 = vinsertps_avx(auVar209,auVar239,0x1c);
  auVar101._0_4_ = auVar12._0_4_ * auVar110._0_4_;
  auVar101._4_4_ = auVar12._4_4_ * auVar110._4_4_;
  auVar101._8_4_ = auVar12._8_4_ * auVar110._8_4_;
  auVar101._12_4_ = auVar12._12_4_ * auVar110._12_4_;
  auVar96 = vminps_avx(auVar155,auVar101);
  auVar64 = vmaxps_avx(auVar101,auVar155);
  auVar110 = vinsertps_avx(auVar247,auVar223,0x4c);
  auVar125 = vmovshdup_avx(auVar11);
  auVar232 = vinsertps_avx(auVar239,auVar209,0x4c);
  auVar240._0_4_ = auVar125._0_4_ * auVar110._0_4_;
  auVar240._4_4_ = auVar125._4_4_ * auVar110._4_4_;
  auVar240._8_4_ = auVar125._8_4_ * auVar110._8_4_;
  auVar240._12_4_ = auVar125._12_4_ * auVar110._12_4_;
  auVar224._0_4_ = auVar125._0_4_ * auVar232._0_4_;
  auVar224._4_4_ = auVar125._4_4_ * auVar232._4_4_;
  auVar224._8_4_ = auVar125._8_4_ * auVar232._8_4_;
  auVar224._12_4_ = auVar125._12_4_ * auVar232._12_4_;
  auVar125 = vminps_avx(auVar240,auVar224);
  auVar248._0_4_ = auVar96._0_4_ + auVar125._0_4_;
  auVar248._4_4_ = auVar96._4_4_ + auVar125._4_4_;
  auVar248._8_4_ = auVar96._8_4_ + auVar125._8_4_;
  auVar248._12_4_ = auVar96._12_4_ + auVar125._12_4_;
  auVar96 = vmaxps_avx(auVar224,auVar240);
  auVar102._0_4_ = auVar96._0_4_ + auVar64._0_4_;
  auVar102._4_4_ = auVar96._4_4_ + auVar64._4_4_;
  auVar102._8_4_ = auVar96._8_4_ + auVar64._8_4_;
  auVar102._12_4_ = auVar96._12_4_ + auVar64._12_4_;
  auVar225._8_8_ = 0x3f80000000000000;
  auVar225._0_8_ = 0x3f80000000000000;
  auVar64 = vsubps_avx(auVar225,auVar102);
  auVar96 = vsubps_avx(auVar225,auVar248);
  auVar125 = vsubps_avx(auVar238,auVar234);
  auVar134 = vsubps_avx(auVar65,auVar234);
  auVar116._0_4_ = fVar122 * auVar10._0_4_;
  auVar116._4_4_ = fVar122 * auVar10._4_4_;
  auVar116._8_4_ = fVar122 * auVar10._8_4_;
  auVar116._12_4_ = fVar122 * auVar10._12_4_;
  auVar249._0_4_ = fVar122 * auVar12._0_4_;
  auVar249._4_4_ = fVar122 * auVar12._4_4_;
  auVar249._8_4_ = fVar122 * auVar12._8_4_;
  auVar249._12_4_ = fVar122 * auVar12._12_4_;
  auVar12 = vminps_avx(auVar116,auVar249);
  auVar10 = vmaxps_avx(auVar249,auVar116);
  auVar156._0_4_ = fVar92 * auVar110._0_4_;
  auVar156._4_4_ = fVar92 * auVar110._4_4_;
  auVar156._8_4_ = fVar92 * auVar110._8_4_;
  auVar156._12_4_ = fVar92 * auVar110._12_4_;
  auVar210._0_4_ = fVar92 * auVar232._0_4_;
  auVar210._4_4_ = fVar92 * auVar232._4_4_;
  auVar210._8_4_ = fVar92 * auVar232._8_4_;
  auVar210._12_4_ = fVar92 * auVar232._12_4_;
  auVar110 = vminps_avx(auVar156,auVar210);
  auVar250._0_4_ = auVar12._0_4_ + auVar110._0_4_;
  auVar250._4_4_ = auVar12._4_4_ + auVar110._4_4_;
  auVar250._8_4_ = auVar12._8_4_ + auVar110._8_4_;
  auVar250._12_4_ = auVar12._12_4_ + auVar110._12_4_;
  fVar178 = auVar125._0_4_;
  auVar260._0_4_ = fVar178 * auVar64._0_4_;
  fVar191 = auVar125._4_4_;
  auVar260._4_4_ = fVar191 * auVar64._4_4_;
  fVar192 = auVar125._8_4_;
  auVar260._8_4_ = fVar192 * auVar64._8_4_;
  fVar193 = auVar125._12_4_;
  auVar260._12_4_ = fVar193 * auVar64._12_4_;
  auVar12 = vmaxps_avx(auVar210,auVar156);
  auVar211._0_4_ = fVar178 * auVar96._0_4_;
  auVar211._4_4_ = fVar191 * auVar96._4_4_;
  auVar211._8_4_ = fVar192 * auVar96._8_4_;
  auVar211._12_4_ = fVar193 * auVar96._12_4_;
  fVar93 = auVar134._0_4_;
  auVar103._0_4_ = fVar93 * auVar64._0_4_;
  fVar62 = auVar134._4_4_;
  auVar103._4_4_ = fVar62 * auVar64._4_4_;
  fVar145 = auVar134._8_4_;
  auVar103._8_4_ = fVar145 * auVar64._8_4_;
  fVar216 = auVar134._12_4_;
  auVar103._12_4_ = fVar216 * auVar64._12_4_;
  auVar226._0_4_ = fVar93 * auVar96._0_4_;
  auVar226._4_4_ = fVar62 * auVar96._4_4_;
  auVar226._8_4_ = fVar145 * auVar96._8_4_;
  auVar226._12_4_ = fVar216 * auVar96._12_4_;
  auVar117._0_4_ = auVar10._0_4_ + auVar12._0_4_;
  auVar117._4_4_ = auVar10._4_4_ + auVar12._4_4_;
  auVar117._8_4_ = auVar10._8_4_ + auVar12._8_4_;
  auVar117._12_4_ = auVar10._12_4_ + auVar12._12_4_;
  auVar157._8_8_ = 0x3f800000;
  auVar157._0_8_ = 0x3f800000;
  auVar10 = vsubps_avx(auVar157,auVar117);
  auVar12 = vsubps_avx(auVar157,auVar250);
  auVar251._0_4_ = fVar178 * auVar10._0_4_;
  auVar251._4_4_ = fVar191 * auVar10._4_4_;
  auVar251._8_4_ = fVar192 * auVar10._8_4_;
  auVar251._12_4_ = fVar193 * auVar10._12_4_;
  auVar241._0_4_ = fVar178 * auVar12._0_4_;
  auVar241._4_4_ = fVar191 * auVar12._4_4_;
  auVar241._8_4_ = fVar192 * auVar12._8_4_;
  auVar241._12_4_ = fVar193 * auVar12._12_4_;
  auVar118._0_4_ = fVar93 * auVar10._0_4_;
  auVar118._4_4_ = fVar62 * auVar10._4_4_;
  auVar118._8_4_ = fVar145 * auVar10._8_4_;
  auVar118._12_4_ = fVar216 * auVar10._12_4_;
  auVar158._0_4_ = fVar93 * auVar12._0_4_;
  auVar158._4_4_ = fVar62 * auVar12._4_4_;
  auVar158._8_4_ = fVar145 * auVar12._8_4_;
  auVar158._12_4_ = fVar216 * auVar12._12_4_;
  auVar10 = vminps_avx(auVar251,auVar241);
  auVar12 = vminps_avx(auVar118,auVar158);
  auVar10 = vminps_avx(auVar10,auVar12);
  auVar12 = vmaxps_avx(auVar241,auVar251);
  auVar110 = vmaxps_avx(auVar158,auVar118);
  auVar232 = vminps_avx(auVar260,auVar211);
  auVar64 = vminps_avx(auVar103,auVar226);
  auVar232 = vminps_avx(auVar232,auVar64);
  auVar10 = vhaddps_avx(auVar10,auVar232);
  auVar12 = vmaxps_avx(auVar110,auVar12);
  auVar110 = vmaxps_avx(auVar211,auVar260);
  auVar232 = vmaxps_avx(auVar226,auVar103);
  auVar110 = vmaxps_avx(auVar232,auVar110);
  auVar12 = vhaddps_avx(auVar12,auVar110);
  auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
  auVar12 = vshufps_avx(auVar12,auVar12,0xe8);
  auVar227._0_4_ = auVar63._0_4_ + auVar10._0_4_;
  auVar227._4_4_ = auVar63._4_4_ + auVar10._4_4_;
  auVar227._8_4_ = auVar63._8_4_ + auVar10._8_4_;
  auVar227._12_4_ = auVar63._12_4_ + auVar10._12_4_;
  auVar212._0_4_ = auVar63._0_4_ + auVar12._0_4_;
  auVar212._4_4_ = auVar63._4_4_ + auVar12._4_4_;
  auVar212._8_4_ = auVar63._8_4_ + auVar12._8_4_;
  auVar212._12_4_ = auVar63._12_4_ + auVar12._12_4_;
  auVar215 = ZEXT1664(auVar212);
  auVar10 = vmaxps_avx(auVar238,auVar227);
  auVar12 = vminps_avx(auVar212,auVar65);
  auVar10 = vcmpps_avx(auVar12,auVar10,1);
  auVar10 = vshufps_avx(auVar10,auVar10,0x50);
  if ((auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar10[0xf] < '\0')
  goto LAB_01623dca;
  bVar54 = 0;
  if ((auVar190._0_4_ < auVar227._0_4_) && (bVar54 = 0, auVar212._0_4_ < auVar65._0_4_)) {
    auVar12 = vmovshdup_avx(auVar227);
    auVar10 = vcmpps_avx(auVar212,auVar65,1);
    bVar54 = auVar10[4] & auVar95._0_4_ < auVar12._0_4_;
  }
  if (((3 < uVar51 || fVar60 < 0.001) | bVar54) == 1) {
    lVar53 = 200;
    auVar215 = ZEXT1664(local_478);
    do {
      fVar62 = auVar63._0_4_;
      fVar93 = 1.0 - fVar62;
      fVar60 = fVar93 * fVar93 * fVar93;
      fVar91 = fVar62 * 3.0 * fVar93 * fVar93;
      fVar93 = fVar93 * fVar62 * fVar62 * 3.0;
      auVar140._4_4_ = fVar60;
      auVar140._0_4_ = fVar60;
      auVar140._8_4_ = fVar60;
      auVar140._12_4_ = fVar60;
      auVar119._4_4_ = fVar91;
      auVar119._0_4_ = fVar91;
      auVar119._8_4_ = fVar91;
      auVar119._12_4_ = fVar91;
      auVar104._4_4_ = fVar93;
      auVar104._0_4_ = fVar93;
      auVar104._8_4_ = fVar93;
      auVar104._12_4_ = fVar93;
      fVar62 = fVar62 * fVar62 * fVar62;
      auVar159._0_4_ = (float)local_238._0_4_ * fVar62;
      auVar159._4_4_ = (float)local_238._4_4_ * fVar62;
      auVar159._8_4_ = fStack_230 * fVar62;
      auVar159._12_4_ = fStack_22c * fVar62;
      auVar13 = vfmadd231ps_fma(auVar159,local_4e8,auVar104);
      auVar13 = vfmadd231ps_fma(auVar13,local_4d8,auVar119);
      auVar13 = vfmadd231ps_fma(auVar13,local_478,auVar140);
      auVar105._8_8_ = auVar13._0_8_;
      auVar105._0_8_ = auVar13._0_8_;
      auVar13 = vshufpd_avx(auVar13,auVar13,3);
      auVar10 = vshufps_avx(auVar63,auVar63,0x55);
      auVar13 = vsubps_avx(auVar13,auVar105);
      auVar10 = vfmadd213ps_fma(auVar13,auVar10,auVar105);
      fVar60 = auVar10._0_4_;
      auVar13 = vshufps_avx(auVar10,auVar10,0x55);
      auVar106._0_4_ = fVar122 * fVar60 + fVar92 * auVar13._0_4_;
      auVar106._4_4_ = auVar265._4_4_ * fVar60 + auVar11._4_4_ * auVar13._4_4_;
      auVar106._8_4_ = auVar265._8_4_ * fVar60 + auVar11._8_4_ * auVar13._8_4_;
      auVar106._12_4_ = auVar265._12_4_ * fVar60 + auVar11._12_4_ * auVar13._12_4_;
      auVar63 = vsubps_avx(auVar63,auVar106);
      auVar13 = vandps_avx(local_3f8,auVar10);
      auVar10 = vshufps_avx(auVar13,auVar13,0xf5);
      auVar13 = vmaxss_avx(auVar10,auVar13);
      if (auVar13._0_4_ < (float)local_4c8._0_4_) {
        fVar60 = auVar63._0_4_;
        if ((0.0 <= fVar60) && (fVar60 <= 1.0)) {
          auVar13 = vmovshdup_avx(auVar63);
          fVar91 = auVar13._0_4_;
          if ((0.0 <= fVar91) && (fVar91 <= 1.0)) {
            auVar13 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                    ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
            auVar110 = vinsertps_avx(auVar13,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28
                                    );
            aVar2 = (ray->org).field_0;
            auVar13 = vsubps_avx(local_408,(undefined1  [16])aVar2);
            auVar13 = vdpps_avx(auVar13,auVar110,0x7f);
            auVar10 = vsubps_avx(local_438,(undefined1  [16])aVar2);
            auVar10 = vdpps_avx(auVar10,auVar110,0x7f);
            auVar265 = vsubps_avx(local_448,(undefined1  [16])aVar2);
            auVar265 = vdpps_avx(auVar265,auVar110,0x7f);
            auVar11 = vsubps_avx(local_428,(undefined1  [16])aVar2);
            auVar11 = vdpps_avx(auVar11,auVar110,0x7f);
            auVar12 = vsubps_avx(_local_418,(undefined1  [16])aVar2);
            auVar12 = vdpps_avx(auVar12,auVar110,0x7f);
            auVar238 = vsubps_avx(_local_458,(undefined1  [16])aVar2);
            auVar238 = vdpps_avx(auVar238,auVar110,0x7f);
            auVar65 = vsubps_avx(_local_468,(undefined1  [16])aVar2);
            auVar65 = vdpps_avx(auVar65,auVar110,0x7f);
            auVar46._4_4_ = fStack_4a4;
            auVar46._0_4_ = local_4a8;
            auVar46._8_4_ = fStack_4a0;
            auVar46._12_4_ = fStack_49c;
            auVar232 = vsubps_avx(auVar46,(undefined1  [16])aVar2);
            auVar110 = vdpps_avx(auVar232,auVar110,0x7f);
            fVar122 = 1.0 - fVar91;
            auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * fVar91)),ZEXT416((uint)fVar122)
                                      ,auVar13);
            auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar238._0_4_ * fVar91)),
                                      ZEXT416((uint)fVar122),auVar10);
            auVar265 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * fVar91)),
                                       ZEXT416((uint)fVar122),auVar265);
            auVar215 = ZEXT1664(auVar265);
            auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar91 * auVar110._0_4_)),
                                      ZEXT416((uint)fVar122),auVar11);
            fVar93 = 1.0 - fVar60;
            fVar91 = fVar93 * fVar60 * fVar60 * 3.0;
            fVar145 = fVar60 * fVar60 * fVar60;
            auVar265 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar145)),
                                       ZEXT416((uint)fVar91),auVar265);
            fVar122 = fVar60 * 3.0 * fVar93 * fVar93;
            auVar10 = vfmadd231ss_fma(auVar265,ZEXT416((uint)fVar122),auVar10);
            fVar92 = fVar93 * fVar93 * fVar93;
            auVar13 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar92),auVar13);
            fVar62 = auVar13._0_4_;
            if (((ray->org).field_0.m128[3] <= fVar62) && (fVar62 <= ray->tfar)) {
              pGVar5 = (context->scene->geometries).items[local_4b0].ptr;
              if ((pGVar5->mask & ray->mask) == 0) {
                bVar54 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar54 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_508._0_4_ = ray->tfar;
                auVar13 = vshufps_avx(auVar63,auVar63,0x55);
                auVar200._8_4_ = 0x3f800000;
                auVar200._0_8_ = 0x3f8000003f800000;
                auVar200._12_4_ = 0x3f800000;
                auVar10 = vsubps_avx(auVar200,auVar13);
                fVar216 = auVar13._0_4_;
                auVar213._0_4_ = fVar216 * (float)local_418._0_4_;
                fVar178 = auVar13._4_4_;
                auVar213._4_4_ = fVar178 * (float)local_418._4_4_;
                fVar191 = auVar13._8_4_;
                auVar213._8_4_ = fVar191 * fStack_410;
                fVar192 = auVar13._12_4_;
                auVar213._12_4_ = fVar192 * fStack_40c;
                auVar228._0_4_ = fVar216 * (float)local_458._0_4_;
                auVar228._4_4_ = fVar178 * (float)local_458._4_4_;
                auVar228._8_4_ = fVar191 * fStack_450;
                auVar228._12_4_ = fVar192 * fStack_44c;
                auVar235._0_4_ = fVar216 * (float)local_468._0_4_;
                auVar235._4_4_ = fVar178 * (float)local_468._4_4_;
                auVar235._8_4_ = fVar191 * fStack_460;
                auVar235._12_4_ = fVar192 * fStack_45c;
                auVar185._0_4_ = fVar216 * local_4a8;
                auVar185._4_4_ = fVar178 * fStack_4a4;
                auVar185._8_4_ = fVar191 * fStack_4a0;
                auVar185._12_4_ = fVar192 * fStack_49c;
                auVar13 = vfmadd231ps_fma(auVar213,auVar10,local_408);
                auVar265 = vfmadd231ps_fma(auVar228,auVar10,local_438);
                auVar11 = vfmadd231ps_fma(auVar235,auVar10,local_448);
                auVar12 = vfmadd231ps_fma(auVar185,auVar10,local_428);
                auVar13 = vsubps_avx(auVar265,auVar13);
                auVar10 = vsubps_avx(auVar11,auVar265);
                auVar215 = ZEXT1664(auVar10);
                auVar265 = vsubps_avx(auVar12,auVar11);
                auVar236._0_4_ = fVar60 * auVar10._0_4_;
                auVar236._4_4_ = fVar60 * auVar10._4_4_;
                auVar236._8_4_ = fVar60 * auVar10._8_4_;
                auVar236._12_4_ = fVar60 * auVar10._12_4_;
                auVar176._4_4_ = fVar93;
                auVar176._0_4_ = fVar93;
                auVar176._8_4_ = fVar93;
                auVar176._12_4_ = fVar93;
                auVar13 = vfmadd231ps_fma(auVar236,auVar176,auVar13);
                auVar186._0_4_ = fVar60 * auVar265._0_4_;
                auVar186._4_4_ = fVar60 * auVar265._4_4_;
                auVar186._8_4_ = fVar60 * auVar265._8_4_;
                auVar186._12_4_ = fVar60 * auVar265._12_4_;
                auVar265 = vfmadd231ps_fma(auVar186,auVar176,auVar10);
                auVar187._0_4_ = fVar60 * auVar265._0_4_;
                auVar187._4_4_ = fVar60 * auVar265._4_4_;
                auVar187._8_4_ = fVar60 * auVar265._8_4_;
                auVar187._12_4_ = fVar60 * auVar265._12_4_;
                auVar265 = vfmadd231ps_fma(auVar187,auVar176,auVar13);
                auVar160._0_4_ = fVar145 * (float)local_298._0_4_;
                auVar160._4_4_ = fVar145 * (float)local_298._4_4_;
                auVar160._8_4_ = fVar145 * fStack_290;
                auVar160._12_4_ = fVar145 * fStack_28c;
                auVar120._4_4_ = fVar91;
                auVar120._0_4_ = fVar91;
                auVar120._8_4_ = fVar91;
                auVar120._12_4_ = fVar91;
                auVar13 = vfmadd132ps_fma(auVar120,auVar160,local_288);
                auVar141._4_4_ = fVar122;
                auVar141._0_4_ = fVar122;
                auVar141._8_4_ = fVar122;
                auVar141._12_4_ = fVar122;
                auVar13 = vfmadd132ps_fma(auVar141,auVar13,local_278);
                auVar121._0_4_ = auVar265._0_4_ * 3.0;
                auVar121._4_4_ = auVar265._4_4_ * 3.0;
                auVar121._8_4_ = auVar265._8_4_ * 3.0;
                auVar121._12_4_ = auVar265._12_4_ * 3.0;
                auVar130._4_4_ = fVar92;
                auVar130._0_4_ = fVar92;
                auVar130._8_4_ = fVar92;
                auVar130._12_4_ = fVar92;
                auVar265 = vfmadd132ps_fma(auVar130,auVar13,local_268);
                auVar13 = vshufps_avx(auVar121,auVar121,0xc9);
                auVar142._0_4_ = auVar265._0_4_ * auVar13._0_4_;
                auVar142._4_4_ = auVar265._4_4_ * auVar13._4_4_;
                auVar142._8_4_ = auVar265._8_4_ * auVar13._8_4_;
                auVar142._12_4_ = auVar265._12_4_ * auVar13._12_4_;
                auVar13 = vshufps_avx(auVar265,auVar265,0xc9);
                auVar265 = vfmsub231ps_fma(auVar142,auVar121,auVar13);
                auVar13 = vshufps_avx(auVar265,auVar265,0xe9);
                local_2c8 = vmovlps_avx(auVar13);
                local_2c0 = auVar265._0_4_;
                local_2bc = vmovlps_avx(auVar63);
                local_2b4 = (int)local_370;
                local_2b0 = (int)local_4b0;
                local_2ac = context->user->instID[0];
                local_2a8 = context->user->instPrimID[0];
                ray->tfar = fVar62;
                local_50c = -1;
                local_348.valid = &local_50c;
                local_348.geometryUserPtr = pGVar5->userPtr;
                local_348.context = context->user;
                local_348.hit = (RTCHitN *)&local_2c8;
                local_348.N = 1;
                local_348.ray = (RTCRayN *)ray;
                if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01624ad9:
                  p_Var6 = context->args->filter;
                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar215 = ZEXT1664(auVar215._0_16_);
                    (*p_Var6)(&local_348);
                    if (*local_348.valid == 0) goto LAB_01624b2b;
                  }
                  bVar54 = 1;
                }
                else {
                  auVar215 = ZEXT1664(auVar10);
                  (*pGVar5->occlusionFilterN)(&local_348);
                  if (*local_348.valid != 0) goto LAB_01624ad9;
LAB_01624b2b:
                  ray->tfar = (float)local_508._0_4_;
                  bVar54 = 0;
                }
              }
              bVar57 = (bool)(bVar57 | bVar54);
            }
          }
        }
        break;
      }
      lVar53 = lVar53 + -1;
    } while (lVar53 != 0);
    goto LAB_01623dca;
  }
  local_248 = vinsertps_avx(auVar13,ZEXT416((uint)fVar91),0x10);
  auVar76 = vinsertps_avx(auVar95,ZEXT416((uint)auVar133._0_4_),0x10);
  goto LAB_01623850;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }